

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm_int8.h
# Opt level: O1

int ncnn::convolution_im2col_gemm_int8
              (Mat *bottom_blob,Mat *top_blob,Mat *AT,int kernel_w,int kernel_h,int dilation_w,
              int dilation_h,int stride_w,int stride_h,int nT,Option *opt)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [32];
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  size_t sVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  int *piVar13;
  undefined1 auVar14 [12];
  int iVar15;
  int iVar16;
  undefined1 (*pauVar17) [64];
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [64];
  uint uVar29;
  uint uVar30;
  int iVar31;
  undefined1 (*pauVar32) [64];
  uint uVar33;
  int iVar34;
  uint uVar35;
  undefined8 *puVar36;
  undefined1 *puVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  int iVar44;
  int iVar45;
  long lVar46;
  int iVar47;
  undefined4 in_register_00000084;
  long lVar48;
  int k;
  long lVar49;
  int iVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  uint uVar55;
  int iVar56;
  int iVar57;
  long lVar58;
  int iVar59;
  long lVar60;
  int N;
  long lVar61;
  undefined1 (*pauVar62) [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  __m128i _vindex;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  long local_2f8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_298;
  int TILE_N;
  uint local_27c;
  int TILE_K;
  int TILE_M;
  undefined8 local_270;
  ulong local_268;
  Mat *local_260;
  Mat local_258;
  int local_204;
  size_t local_200;
  long local_1f8;
  ulong local_1f0;
  long local_1e8;
  uint local_1dc;
  Mat local_1d8;
  Mat m;
  undefined1 local_138 [44];
  int iStack_10c;
  undefined8 uStack_108;
  int local_100;
  size_t local_f8;
  undefined1 local_e8 [44];
  int iStack_bc;
  undefined8 uStack_b8;
  int local_b0;
  size_t local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  Mat *local_80;
  undefined1 local_78 [64];
  
  local_270 = CONCAT44(in_register_00000084,kernel_h);
  iVar59 = kernel_h * kernel_w;
  uVar29 = top_blob->elempack * top_blob->c;
  N = top_blob->h * top_blob->w;
  uVar55 = bottom_blob->c * iVar59 * bottom_blob->elempack;
  local_260 = top_blob;
  local_80 = AT;
  convolution_im2col_gemm_get_optimal_tile_mnk_int8(uVar29,N,uVar55,&TILE_M,&TILE_N,&TILE_K,nT);
  local_204 = (int)(uVar29 + TILE_M + -1) / TILE_M;
  iVar50 = (N + TILE_N + -1) / TILE_N;
  iVar24 = (int)(uVar55 + TILE_K + -1) / TILE_K;
  local_1d8.cstep = 0;
  local_1d8.data = (void *)0x0;
  local_1d8.refcount._0_4_ = 0;
  local_1d8.refcount._4_4_ = 0;
  local_1d8.elemsize = 0;
  local_1d8.elempack = 0;
  local_1d8.allocator = (Allocator *)0x0;
  local_1d8.dims = 0;
  local_1d8.w = 0;
  local_1d8.h = 0;
  local_1d8.d = 0;
  local_1d8.c = 0;
  local_1f0 = (ulong)uVar55;
  local_88 = (ulong)uVar29;
  Mat::create(&local_1d8,TILE_K * TILE_N,iVar24,iVar50,1,opt->workspace_allocator);
  iVar31 = -100;
  if ((local_1d8.data != (void *)0x0) && ((long)local_1d8.c * local_1d8.cstep != 0)) {
    iVar50 = iVar50 * iVar24;
    local_1e8 = CONCAT44(local_1e8._4_4_,iVar50);
    if (0 < iVar50) {
      iVar31 = (int)local_270;
      local_a0 = (ulong)(uint)~((kernel_w + -1) * dilation_w);
      auVar75 = vpbroadcastd_avx512f();
      local_78 = vmovdqu64_avx512f(auVar75);
      uVar43 = 0;
      do {
        iVar50 = (int)uVar43 / iVar24;
        uVar38 = (long)(int)uVar43 % (long)iVar24;
        iVar47 = TILE_N * iVar50;
        k = TILE_K * (int)uVar38;
        uVar29 = N - iVar47;
        if (TILE_N < N - iVar47) {
          uVar29 = TILE_N;
        }
        uVar55 = (int)local_1f0 - k;
        if (TILE_K < (int)uVar55) {
          uVar55 = TILE_K;
        }
        local_258.cstep = (size_t)local_1d8.w;
        local_258.data =
             (void *)((long)local_1d8.data +
                     (uVar38 & 0xffffffff) * local_258.cstep * local_1d8.elemsize +
                     (long)iVar50 * local_1d8.cstep * local_1d8.elemsize);
        local_258.refcount._0_4_ = 0;
        local_258.refcount._4_4_ = 0;
        local_258.elemsize = local_1d8.elemsize;
        local_258.elempack = local_1d8.elempack;
        local_258.allocator = local_1d8.allocator;
        local_258.dims = 2;
        local_258.w = local_1d8.w;
        local_258.h = 1;
        local_258.d = 1;
        local_258.c = 1;
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
        local_268 = uVar43;
        iVar50 = cpu_support_x86_avx512_vnni();
        if (iVar50 == 0) {
          iVar50 = cpu_support_x86_avx_vnni_int8();
          if (iVar50 == 0) {
            iVar50 = cpu_support_x86_avx_vnni();
            if (iVar50 == 0) {
              if ((stride_h == 1 &&
                  (dilation_h == 1 && (dilation_w == 1 && (iVar31 == 1 && kernel_w == 1)))) &&
                  stride_w == 1) {
                iVar50 = bottom_blob->elempack;
                local_200 = bottom_blob->cstep;
                uVar43 = 0;
                iVar3 = (int)local_200;
                pauVar17 = (undefined1 (*) [64])local_258.data;
                if (0xf < (int)uVar29) {
                  iVar25 = k + 7;
                  if (-1 < k) {
                    iVar25 = k;
                  }
                  uVar35 = uVar55 + 7;
                  if (-1 < (int)uVar55) {
                    uVar35 = uVar55;
                  }
                  lVar21 = (long)iVar47;
                  lVar23 = lVar21 * 8 + 0x40;
                  uVar38 = 0;
                  do {
                    if (7 < (int)uVar55 && iVar50 == 8) {
                      pauVar62 = (undefined1 (*) [16])
                                 (bottom_blob->cstep * (long)(iVar25 >> 3) * bottom_blob->elemsize +
                                  lVar23 + (long)bottom_blob->data);
                      iVar56 = (int)uVar35 >> 3;
                      do {
                        auVar65 = vpunpcklwd_avx(pauVar62[-4],pauVar62[-3]);
                        auVar66 = vpunpckhwd_avx(pauVar62[-4],pauVar62[-3]);
                        auVar115 = vpunpcklwd_avx(pauVar62[-2],pauVar62[-1]);
                        auVar63 = vpunpckhwd_avx(pauVar62[-2],pauVar62[-1]);
                        auVar113 = vpunpcklwd_avx(*pauVar62,pauVar62[1]);
                        auVar64 = vpunpckhwd_avx(*pauVar62,pauVar62[1]);
                        auVar107 = vpunpcklwd_avx(pauVar62[2],pauVar62[3]);
                        auVar111 = vpunpckhwd_avx(pauVar62[2],pauVar62[3]);
                        auVar109 = vpunpcklwd_avx(auVar65,auVar66);
                        auVar66 = vpunpckhwd_avx(auVar65,auVar66);
                        auVar65 = vpunpcklwd_avx(auVar115,auVar63);
                        auVar63 = vpunpckhwd_avx(auVar115,auVar63);
                        auVar115 = vpunpcklwd_avx(auVar113,auVar64);
                        auVar64 = vpunpckhwd_avx(auVar113,auVar64);
                        auVar113 = vpunpcklwd_avx(auVar107,auVar111);
                        auVar111 = vpunpckhwd_avx(auVar107,auVar111);
                        auVar107 = vpunpcklqdq_avx(auVar109,auVar65);
                        auVar108 = vpunpcklqdq_avx(auVar115,auVar113);
                        in_ZMM9 = ZEXT1664(auVar108);
                        auVar65 = vpunpckhqdq_avx(auVar109,auVar65);
                        auVar115 = vpunpckhqdq_avx(auVar115,auVar113);
                        auVar113 = vpunpcklqdq_avx(auVar66,auVar63);
                        auVar109 = vpunpcklqdq_avx(auVar64,auVar111);
                        in_ZMM8 = ZEXT1664(auVar109);
                        auVar66 = vpunpckhqdq_avx(auVar66,auVar63);
                        auVar63 = vpunpckhqdq_avx(auVar64,auVar111);
                        *(undefined1 (*) [16])*pauVar17 = auVar107;
                        *(undefined1 (*) [16])(*pauVar17 + 0x10) = auVar108;
                        *(undefined1 (*) [16])(*pauVar17 + 0x20) = auVar65;
                        *(undefined1 (*) [16])(*pauVar17 + 0x30) = auVar115;
                        *(undefined1 (*) [16])pauVar17[1] = auVar113;
                        *(undefined1 (*) [16])(pauVar17[1] + 0x10) = auVar109;
                        *(undefined1 (*) [16])(pauVar17[1] + 0x20) = auVar66;
                        *(undefined1 (*) [16])(pauVar17[1] + 0x30) = auVar63;
                        pauVar17 = pauVar17 + 2;
                        pauVar62 = (undefined1 (*) [16])(*pauVar62 + iVar3 * 8);
                        iVar56 = iVar56 + -1;
                      } while (iVar56 != 0);
                    }
                    if (iVar50 == 1) {
                      lVar54 = bottom_blob->cstep * (long)k * bottom_blob->elemsize;
                      if ((int)uVar55 < 2) {
                        pauVar62 = (undefined1 (*) [16])
                                   ((long)bottom_blob->data + lVar54 + lVar21 + uVar38);
                        uVar30 = 0;
                      }
                      else {
                        lVar54 = (long)bottom_blob->data + lVar54 + uVar38;
                        iVar56 = 1;
                        do {
                          auVar66 = *(undefined1 (*) [16])(lVar54 + lVar21 + iVar3);
                          auVar63 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar54 + lVar21),auVar66);
                          auVar66 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar54 + lVar21),auVar66);
                          *(undefined1 (*) [16])*pauVar17 = auVar63;
                          *(undefined1 (*) [16])(*pauVar17 + 0x10) = auVar66;
                          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
                          lVar54 = lVar54 + iVar3 * 2;
                          iVar56 = iVar56 + 2;
                        } while (iVar56 < (int)uVar55);
                        pauVar62 = (undefined1 (*) [16])(lVar54 + lVar21);
                        uVar30 = uVar55 & 0xfffffffe;
                      }
                      iVar56 = uVar55 - uVar30;
                      if (iVar56 != 0 && (int)uVar30 <= (int)uVar55) {
                        do {
                          *(undefined1 (*) [16])*pauVar17 = *pauVar62;
                          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
                          pauVar62 = (undefined1 (*) [16])(*pauVar62 + iVar3);
                          iVar56 = iVar56 + -1;
                        } while (iVar56 != 0);
                      }
                    }
                    uVar43 = uVar38 + 0x10;
                    uVar27 = uVar38 + 0x1f;
                    lVar23 = lVar23 + 0x80;
                    uVar38 = uVar43;
                  } while (uVar27 < uVar29);
                }
                if ((int)((uint)uVar43 | 7) < (int)uVar29) {
                  iVar25 = k + 7;
                  if (-1 < k) {
                    iVar25 = k;
                  }
                  uVar35 = uVar55 + 7;
                  if (-1 < (int)uVar55) {
                    uVar35 = uVar55;
                  }
                  lVar54 = (long)iVar47;
                  lVar23 = lVar54 + (uVar43 & 0xffffffff);
                  lVar21 = lVar23 + iVar3;
                  uVar38 = uVar43 & 0xffffffff;
                  do {
                    if (7 < (int)uVar55 && iVar50 == 8) {
                      pauVar62 = (undefined1 (*) [16])
                                 ((long)bottom_blob->data +
                                 (lVar54 + uVar38) * 8 +
                                 bottom_blob->cstep * (long)(iVar25 >> 3) * bottom_blob->elemsize);
                      iVar56 = (int)uVar35 >> 3;
                      do {
                        auVar64 = vpunpcklwd_avx(*pauVar62,pauVar62[1]);
                        auVar66 = vpunpckhwd_avx(*pauVar62,pauVar62[1]);
                        auVar111 = vpunpcklwd_avx(pauVar62[2],pauVar62[3]);
                        auVar63 = vpunpckhwd_avx(pauVar62[2],pauVar62[3]);
                        auVar65 = vpunpcklwd_avx(auVar64,auVar66);
                        auVar66 = vpunpckhwd_avx(auVar64,auVar66);
                        auVar64 = vpunpcklwd_avx(auVar111,auVar63);
                        auVar63 = vpunpckhwd_avx(auVar111,auVar63);
                        auVar111 = vpunpcklqdq_avx(auVar65,auVar64);
                        auVar64 = vpunpckhqdq_avx(auVar65,auVar64);
                        auVar65 = vpunpcklqdq_avx(auVar66,auVar63);
                        auVar66 = vpunpckhqdq_avx(auVar66,auVar63);
                        *(undefined1 (*) [16])*pauVar17 = auVar111;
                        *(undefined1 (*) [16])(*pauVar17 + 0x10) = auVar64;
                        *(undefined1 (*) [16])(*pauVar17 + 0x20) = auVar65;
                        *(undefined1 (*) [16])(*pauVar17 + 0x30) = auVar66;
                        pauVar17 = pauVar17 + 1;
                        pauVar62 = (undefined1 (*) [16])(*pauVar62 + iVar3 * 8);
                        iVar56 = iVar56 + -1;
                      } while (iVar56 != 0);
                    }
                    if (iVar50 == 1) {
                      pvVar7 = bottom_blob->data;
                      lVar18 = bottom_blob->cstep * (long)k * bottom_blob->elemsize;
                      if ((int)uVar55 < 2) {
                        lVar19 = (long)pvVar7 + lVar54 + uVar38;
                        uVar30 = 0;
                      }
                      else {
                        lVar19 = (long)pvVar7 + lVar23;
                        lVar20 = (long)pvVar7 + lVar21;
                        iVar56 = 1;
                        do {
                          auVar107._8_8_ = 0;
                          auVar107._0_8_ = *(ulong *)(lVar19 + lVar18);
                          auVar109._8_8_ = 0;
                          auVar109._0_8_ = *(ulong *)(lVar20 + lVar18);
                          auVar66 = vpunpcklbw_avx(auVar107,auVar109);
                          *(undefined1 (*) [16])*pauVar17 = auVar66;
                          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
                          lVar19 = lVar19 + iVar3 * 2;
                          lVar20 = lVar20 + iVar3 * 2;
                          iVar56 = iVar56 + 2;
                          uVar30 = uVar55 & 0xfffffffe;
                        } while (iVar56 < (int)uVar55);
                      }
                      puVar36 = (undefined8 *)(lVar19 + lVar18);
                      iVar56 = uVar55 - uVar30;
                      if (iVar56 != 0 && (int)uVar30 <= (int)uVar55) {
                        do {
                          *(undefined8 *)*pauVar17 = *puVar36;
                          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 8);
                          puVar36 = (undefined8 *)((long)puVar36 + (long)iVar3);
                          iVar56 = iVar56 + -1;
                        } while (iVar56 != 0);
                      }
                    }
                    uVar43 = uVar38 + 8;
                    lVar18 = uVar38 + 0xf;
                    lVar23 = lVar23 + 8;
                    lVar21 = lVar21 + 8;
                    uVar38 = uVar43;
                  } while (lVar18 < (int)uVar29);
                }
                if ((int)((uint)uVar43 | 3) < (int)uVar29) {
                  iVar25 = k + 7;
                  if (-1 < k) {
                    iVar25 = k;
                  }
                  local_27c = uVar55 + 7;
                  if (-1 < (int)uVar55) {
                    local_27c = uVar55;
                  }
                  local_27c = (int)local_27c >> 3;
                  local_1f8 = (long)k;
                  lVar23 = local_200 << 0x20;
                  lVar21 = (long)(iVar3 * 2);
                  local_1dc = uVar55 & 0xfffffffe;
                  local_98 = (long)iVar47;
                  local_2c8 = local_98 + (uVar43 & 0xffffffff);
                  local_2f8 = local_2c8 * 8 + 0x10;
                  local_2c0 = (lVar23 + 0x300000000 >> 0x20) + local_2c8;
                  local_298 = (lVar23 + 0x200000000 >> 0x20) + local_2c8;
                  local_2d0 = (lVar23 + 0x100000000 >> 0x20) + local_2c8;
                  lVar23 = local_2c8 + iVar3;
                  uVar38 = uVar43 & 0xffffffff;
                  do {
                    if (7 < (int)uVar55 && iVar50 == 8) {
                      lVar54 = bottom_blob->cstep * (long)(iVar25 >> 3) * bottom_blob->elemsize;
                      lVar18 = (long)bottom_blob->data + local_2f8;
                      uVar35 = local_27c;
                      do {
                        auVar66 = *(undefined1 (*) [16])(lVar18 + -0x10 + lVar54);
                        auVar63 = *(undefined1 (*) [16])(lVar18 + lVar54);
                        auVar64 = vpunpcklwd_avx(auVar66,auVar63);
                        auVar66 = vpunpckhwd_avx(auVar66,auVar63);
                        auVar63 = vpunpcklwd_avx(auVar64,auVar66);
                        auVar66 = vpunpckhwd_avx(auVar64,auVar66);
                        *(undefined1 (*) [16])*pauVar17 = auVar63;
                        *(undefined1 (*) [16])(*pauVar17 + 0x10) = auVar66;
                        pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
                        lVar18 = lVar18 + iVar3 * 8;
                        uVar35 = uVar35 - 1;
                      } while (uVar35 != 0);
                    }
                    if (iVar50 == 1) {
                      pvVar7 = bottom_blob->data;
                      lVar54 = bottom_blob->cstep * local_1f8 * bottom_blob->elemsize;
                      if ((int)uVar55 < 2) {
                        lVar18 = (long)pvVar7 + local_98 + uVar38;
                        uVar35 = 0;
                      }
                      else {
                        lVar18 = (long)pvVar7 + local_2c8;
                        lVar39 = local_2c0 + (long)pvVar7;
                        lVar19 = (long)pvVar7 + lVar23;
                        lVar20 = (long)pvVar7 + local_298;
                        lVar40 = (long)pvVar7 + local_2d0;
                        iVar56 = 1;
                        do {
                          (*pauVar17)[0] = *(undefined1 *)(lVar18 + lVar54);
                          (*pauVar17)[1] = *(undefined1 *)(lVar19 + lVar54);
                          (*pauVar17)[2] = *(undefined1 *)(lVar18 + 1 + lVar54);
                          (*pauVar17)[3] = *(undefined1 *)(lVar40 + lVar54);
                          (*pauVar17)[4] = *(undefined1 *)(lVar18 + 2 + lVar54);
                          (*pauVar17)[5] = *(undefined1 *)(lVar20 + lVar54);
                          (*pauVar17)[6] = *(undefined1 *)(lVar18 + 3 + lVar54);
                          (*pauVar17)[7] = *(undefined1 *)(lVar39 + lVar54);
                          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 8);
                          iVar56 = iVar56 + 2;
                          lVar18 = lVar18 + lVar21;
                          lVar39 = lVar39 + lVar21;
                          lVar19 = lVar19 + lVar21;
                          lVar20 = lVar20 + lVar21;
                          lVar40 = lVar40 + lVar21;
                          local_90 = lVar23;
                          uVar35 = local_1dc;
                        } while (iVar56 < (int)uVar55);
                      }
                      iVar56 = uVar55 - uVar35;
                      if (iVar56 != 0 && (int)uVar35 <= (int)uVar55) {
                        puVar37 = (undefined1 *)(lVar18 + lVar54 + 3);
                        do {
                          (*pauVar17)[0] = puVar37[-3];
                          (*pauVar17)[1] = puVar37[-2];
                          (*pauVar17)[2] = puVar37[-1];
                          (*pauVar17)[3] = *puVar37;
                          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 4);
                          puVar37 = puVar37 + iVar3;
                          iVar56 = iVar56 + -1;
                        } while (iVar56 != 0);
                      }
                    }
                    uVar43 = uVar38 + 4;
                    lVar54 = uVar38 + 7;
                    local_2f8 = local_2f8 + 0x20;
                    local_2c8 = local_2c8 + 4;
                    local_2c0 = local_2c0 + 4;
                    lVar23 = lVar23 + 4;
                    local_298 = local_298 + 4;
                    local_2d0 = local_2d0 + 4;
                    uVar38 = uVar43;
                  } while (lVar54 < (int)uVar29);
                }
                uVar35 = (uint)uVar43;
                if ((int)(uVar35 | 1) < (int)uVar29) {
                  iVar25 = k + 7;
                  if (-1 < k) {
                    iVar25 = k;
                  }
                  uVar30 = uVar55 + 7;
                  if (-1 < (int)uVar55) {
                    uVar30 = uVar55;
                  }
                  lVar54 = (long)(iVar3 * 2);
                  local_27c = uVar55 & 0xfffffffe;
                  local_1f8 = (long)iVar47;
                  lVar23 = (int)uVar35 + local_1f8;
                  lVar21 = lVar23 * 8 + 8;
                  local_2f8 = (iVar3 + 1) + lVar23;
                  local_2d0 = lVar23 + iVar3;
                  uVar38 = (long)(int)uVar35;
                  do {
                    if (7 < (int)uVar55 && iVar50 == 8) {
                      lVar18 = bottom_blob->cstep * (long)(iVar25 >> 3) * bottom_blob->elemsize;
                      lVar19 = (long)bottom_blob->data + lVar21;
                      iVar56 = (int)uVar30 >> 3;
                      do {
                        auVar108._8_8_ = 0;
                        auVar108._0_8_ = *(ulong *)(lVar19 + -8 + lVar18);
                        auVar110._8_8_ = 0;
                        auVar110._0_8_ = *(ulong *)(lVar19 + lVar18);
                        auVar66 = vpunpcklwd_avx(auVar108,auVar110);
                        *(undefined1 (*) [16])*pauVar17 = auVar66;
                        pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
                        lVar19 = lVar19 + iVar3 * 8;
                        iVar56 = iVar56 + -1;
                      } while (iVar56 != 0);
                    }
                    if (iVar50 == 1) {
                      pvVar7 = bottom_blob->data;
                      lVar18 = bottom_blob->cstep * (long)k * bottom_blob->elemsize;
                      if ((int)uVar55 < 2) {
                        lVar19 = (long)pvVar7 + local_1f8 + uVar38;
                        uVar35 = 0;
                      }
                      else {
                        lVar19 = (long)pvVar7 + lVar23;
                        lVar20 = (long)pvVar7 + local_2f8;
                        lVar39 = (long)pvVar7 + local_2d0;
                        iVar56 = 1;
                        do {
                          (*pauVar17)[0] = *(undefined1 *)(lVar19 + lVar18);
                          (*pauVar17)[1] = *(undefined1 *)(lVar39 + lVar18);
                          (*pauVar17)[2] = *(undefined1 *)(lVar19 + 1 + lVar18);
                          (*pauVar17)[3] = *(undefined1 *)(lVar20 + lVar18);
                          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 4);
                          iVar56 = iVar56 + 2;
                          lVar19 = lVar19 + lVar54;
                          lVar20 = lVar20 + lVar54;
                          lVar39 = lVar39 + lVar54;
                          uVar35 = local_27c;
                        } while (iVar56 < (int)uVar55);
                      }
                      iVar56 = uVar55 - uVar35;
                      if (iVar56 != 0 && (int)uVar35 <= (int)uVar55) {
                        puVar37 = (undefined1 *)(lVar19 + lVar18 + 1);
                        do {
                          (*pauVar17)[0] = puVar37[-1];
                          (*pauVar17)[1] = *puVar37;
                          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 2);
                          puVar37 = puVar37 + iVar3;
                          iVar56 = iVar56 + -1;
                        } while (iVar56 != 0);
                      }
                    }
                    uVar43 = uVar38 + 2;
                    lVar18 = uVar38 + 3;
                    lVar21 = lVar21 + 0x10;
                    lVar23 = lVar23 + 2;
                    local_2f8 = local_2f8 + 2;
                    local_2d0 = local_2d0 + 2;
                    uVar38 = uVar43;
                  } while (lVar18 < (int)uVar29);
                }
                if ((int)uVar43 < (int)uVar29) {
                  iVar25 = k + 7;
                  if (-1 < k) {
                    iVar25 = k;
                  }
                  uVar35 = uVar55 + 7;
                  if (-1 < (int)uVar55) {
                    uVar35 = uVar55;
                  }
                  lVar23 = (long)(int)uVar43;
                  do {
                    if (7 < (int)uVar55 && iVar50 == 8) {
                      puVar36 = (undefined8 *)
                                ((long)bottom_blob->data +
                                (lVar23 + iVar47) * 8 +
                                bottom_blob->cstep * (long)(iVar25 >> 3) * bottom_blob->elemsize);
                      iVar56 = (int)uVar35 >> 3;
                      do {
                        *(undefined8 *)*pauVar17 = *puVar36;
                        pauVar17 = (undefined1 (*) [64])(*pauVar17 + 8);
                        puVar36 = (undefined8 *)((long)puVar36 + (long)(iVar3 * 8));
                        iVar56 = iVar56 + -1;
                      } while (iVar56 != 0);
                    }
                    if (iVar50 == 1 && 0 < (int)uVar55) {
                      puVar37 = (undefined1 *)
                                ((long)bottom_blob->data +
                                (long)iVar47 +
                                lVar23 + bottom_blob->cstep * (long)k * bottom_blob->elemsize);
                      uVar30 = uVar55;
                      do {
                        (*pauVar17)[0] = *puVar37;
                        pauVar17 = (undefined1 (*) [64])(*pauVar17 + 1);
                        puVar37 = puVar37 + iVar3;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    lVar23 = lVar23 + 1;
                  } while (lVar23 != (int)uVar29);
                }
              }
              else {
                iVar50 = bottom_blob->elempack;
                iVar3 = bottom_blob->w;
                iVar25 = (int)bottom_blob->cstep;
                uVar35 = ((int)local_a0 + iVar3) / stride_w;
                iVar56 = uVar35 + 1;
                uVar30 = 0;
                if (uVar35 == 0) {
                  uVar33 = 0;
                  uVar35 = 0;
                }
                else {
                  uVar33 = 0x1f;
                  if (uVar35 != 0) {
                    for (; uVar35 >> uVar33 == 0; uVar33 = uVar33 - 1) {
                    }
                  }
                  uVar35 = 1;
                }
                auVar75 = vpbroadcastd_avx512f();
                auVar66 = ZEXT416(uVar33);
                pauVar17 = (undefined1 (*) [64])local_258.data;
                if (0xf < (int)uVar29) {
                  auVar76 = vpbroadcastd_avx512f(ZEXT416(uVar35));
                  iVar51 = iVar3 * dilation_h;
                  uVar33 = uVar55 + 7;
                  if (-1 < (int)uVar55) {
                    uVar33 = uVar55;
                  }
                  auVar77 = vpbroadcastd_avx512f();
                  iVar34 = k + 7;
                  if (-1 < k) {
                    iVar34 = k;
                  }
                  auVar78 = vpbroadcastd_avx512f();
                  uVar22 = 0;
                  do {
                    auVar79 = vpbroadcastd_avx512f();
                    auVar79 = vpaddd_avx512f(auVar79,_DAT_005f3240);
                    auVar80 = vpmuludq_avx512f(auVar79,auVar75);
                    auVar80 = vpsrlq_avx512f(auVar80,0x20);
                    auVar81 = vpsrlq_avx512f(auVar79,0x20);
                    auVar81 = vpmuludq_avx512f(auVar81,auVar75);
                    auVar81 = vmovdqa32_avx512f(auVar81);
                    auVar82._4_4_ = auVar81._4_4_;
                    auVar82._0_4_ = auVar80._0_4_;
                    auVar82._8_4_ = auVar80._8_4_;
                    auVar82._12_4_ = auVar81._12_4_;
                    auVar82._16_4_ = auVar80._16_4_;
                    auVar82._20_4_ = auVar81._20_4_;
                    auVar82._24_4_ = auVar80._24_4_;
                    auVar82._28_4_ = auVar81._28_4_;
                    auVar82._32_4_ = auVar80._32_4_;
                    auVar82._36_4_ = auVar81._36_4_;
                    auVar82._40_4_ = auVar80._40_4_;
                    auVar82._44_4_ = auVar81._44_4_;
                    auVar82._48_4_ = auVar80._48_4_;
                    auVar82._52_4_ = auVar81._52_4_;
                    auVar82._60_4_ = auVar81._60_4_;
                    auVar82._56_4_ = auVar80._56_4_;
                    auVar80 = vpsubd_avx512f(auVar79,auVar82);
                    auVar80 = vpsrlvd_avx512f(auVar80,auVar76);
                    auVar80 = vpaddd_avx512f(auVar80,auVar82);
                    auVar80 = vpsrld_avx512f(auVar80,auVar66);
                    in_ZMM8 = vpmulld_avx512f(auVar80,auVar78);
                    auVar79 = vpsubd_avx512f(auVar79,in_ZMM8);
                    auVar79 = vpmulld_avx512f(auVar79,local_78);
                    auVar80 = vpmulld_avx512f(auVar80,auVar77);
                    if (stride_w == 1) {
                      in_ZMM8 = valignd_avx512f(auVar80,auVar80,0xf);
                      uVar43 = vpcmpeqd_avx512f(auVar80,in_ZMM8);
                      if ((uVar43 & 1) == 0) goto LAB_001ad67d;
                      auVar63 = vpaddd_avx(auVar79._0_16_,auVar80._0_16_);
                      iVar16 = auVar63._0_4_;
                      if (iVar50 == 1) {
                        iVar15 = 0;
                        if (1 < (int)uVar55) {
                          iVar44 = 0;
                          do {
                            uVar43 = (long)(iVar44 + k) % (long)iVar59;
                            iVar15 = iVar44 + k + 1;
                            uVar38 = (long)iVar15 % (long)iVar59;
                            uVar43 = (ulong)(uint)((int)uVar43 >> 0x1f) << 0x20 |
                                     uVar43 & 0xffffffff;
                            uVar38 = (ulong)(uint)((int)uVar38 >> 0x1f) << 0x20 |
                                     uVar38 & 0xffffffff;
                            auVar63 = *(undefined1 (*) [16])
                                       ((long)bottom_blob->data +
                                       (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                              ((iVar44 + k) / iVar59) * iVar25 + iVar16 +
                                             (int)((long)uVar43 / (long)kernel_w) * iVar51));
                            auVar64 = *(undefined1 (*) [16])
                                       ((long)bottom_blob->data +
                                       (long)((int)((long)uVar38 % (long)kernel_w) * dilation_w +
                                              (iVar15 / iVar59) * iVar25 + iVar16 +
                                             (int)((long)uVar38 / (long)kernel_w) * iVar51));
                            auVar111 = vpunpcklbw_avx(auVar63,auVar64);
                            in_ZMM8 = ZEXT1664(auVar111);
                            auVar63 = vpunpckhbw_avx(auVar63,auVar64);
                            *(undefined1 (*) [16])*pauVar17 = auVar111;
                            *(undefined1 (*) [16])(*pauVar17 + 0x10) = auVar63;
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
                            iVar15 = iVar44 + 2;
                            iVar57 = iVar44 + 3;
                            iVar44 = iVar15;
                          } while (iVar57 < (int)uVar55);
                        }
                        iVar44 = uVar55 - iVar15;
                        if (iVar44 != 0 && iVar15 <= (int)uVar55) {
                          iVar15 = iVar15 + k;
                          do {
                            uVar43 = (ulong)(uint)((int)((long)iVar15 % (long)iVar59) >> 0x1f) <<
                                     0x20 | (long)iVar15 % (long)iVar59 & 0xffffffffU;
                            *(undefined1 (*) [16])*pauVar17 =
                                 *(undefined1 (*) [16])
                                  ((long)bottom_blob->data +
                                  (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                         (iVar15 / iVar59) * iVar25 + iVar16 +
                                        (int)((long)uVar43 / (long)kernel_w) * iVar51));
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
                            iVar15 = iVar15 + 1;
                            iVar44 = iVar44 + -1;
                          } while (iVar44 != 0);
                        }
                      }
                      iVar15 = iVar34 >> 3;
                      uVar30 = (int)uVar33 >> 3;
                      if (7 < (int)uVar55 && iVar50 == 8) {
                        do {
                          uVar43 = (ulong)(uint)((int)((long)iVar15 % (long)iVar59) >> 0x1f) << 0x20
                                   | (long)iVar15 % (long)iVar59 & 0xffffffffU;
                          lVar23 = (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                          (iVar15 / iVar59) * iVar25 + iVar16 +
                                         (int)((long)uVar43 / (long)kernel_w) * iVar51);
                          auVar79 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                       ((long)bottom_blob->data + lVar23 * 8));
                          auVar80 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                       ((long)bottom_blob->data + lVar23 * 8 + 0x40)
                                                     );
                          auVar81 = vpunpcklwd_avx512bw(auVar79,auVar80);
                          auVar79 = vpunpckhwd_avx512bw(auVar79,auVar80);
                          auVar80 = vpunpcklwd_avx512bw(auVar81,auVar79);
                          auVar79 = vpunpckhwd_avx512bw(auVar81,auVar79);
                          auVar81 = vshufi64x2_avx512f(auVar80,auVar79,0x88);
                          auVar79 = vshufi64x2_avx512f(auVar80,auVar79,0xdd);
                          auVar80 = vpunpckldq_avx512f(auVar81,auVar79);
                          auVar79 = vpunpckhdq_avx512f(auVar81,auVar79);
                          auVar81 = vshufi64x2_avx512f(auVar80,auVar79,0x88);
                          auVar79 = vshufi64x2_avx512f(auVar80,auVar79,0xdd);
                          auVar80 = vpunpcklqdq_avx512f(auVar81,auVar79);
                          auVar79 = vpunpckhqdq_avx512f(auVar81,auVar79);
                          in_ZMM8 = vinserti64x4_avx512f(auVar80,auVar79._0_32_,1);
                          auVar79 = vshufi64x2_avx512f(auVar80,auVar79,0xee);
                          auVar80 = vshufi64x2_avx512f(in_ZMM8,auVar79,0x88);
                          auVar81 = vshufi64x2_avx512f(in_ZMM8,auVar79,0xdd);
                          auVar79 = vmovdqu64_avx512f(auVar80);
                          *pauVar17 = auVar79;
                          auVar79 = vmovdqu64_avx512f(auVar81);
                          pauVar17[1] = auVar79;
                          pauVar17 = pauVar17 + 2;
                          uVar30 = uVar30 - 1;
                          iVar15 = iVar15 + 1;
                        } while (uVar30 != 0);
                      }
                    }
                    else {
LAB_001ad67d:
                      auVar79 = vpaddd_avx512f(auVar79,auVar80);
                      if (iVar50 == 1) {
                        iVar16 = 0;
                        if (1 < (int)uVar55) {
                          auVar80 = vpmovsxbd_avx512f(_DAT_005f2b00);
                          auVar81 = vpmovsxbd_avx512f(_DAT_005f2b10);
                          iVar15 = 0;
                          do {
                            auVar82 = vpbroadcastd_avx512f();
                            vpaddd_avx512f(auVar82,auVar79);
                            auVar82 = vpbroadcastd_avx512f();
                            vpaddd_avx512f(auVar82,auVar79);
                            auVar82 = vpgatherdd_avx512f(*(undefined4 *)
                                                          ((long)bottom_blob->data +
                                                          (ulong)(uint)(((iVar15 + k) / iVar59) *
                                                                       iVar25)));
                            auVar83 = vpgatherdd_avx512f(*(undefined4 *)
                                                          ((long)bottom_blob->data +
                                                          ((long)(iVar15 + k + 1) % (long)iVar59 &
                                                          0xffffffffU)));
                            auVar84 = vmovdqa64_avx512f(auVar82);
                            in_ZMM8 = vpermt2d_avx512f(auVar84,auVar80,auVar83);
                            auVar63 = vpmovdb_avx512f(in_ZMM8);
                            *(undefined1 (*) [16])*pauVar17 = auVar63;
                            in_ZMM9 = vpermt2d_avx512f(auVar82,auVar81,auVar83);
                            auVar63 = vpmovdb_avx512f(in_ZMM9);
                            *(undefined1 (*) [16])(*pauVar17 + 0x10) = auVar63;
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
                            iVar16 = iVar15 + 2;
                            iVar44 = iVar15 + 3;
                            iVar15 = iVar16;
                          } while (iVar44 < (int)uVar55);
                        }
                        uVar30 = uVar55 - iVar16;
                        if (uVar30 != 0 && iVar16 <= (int)uVar55) {
                          do {
                            auVar80 = vpbroadcastd_avx512f();
                            vpaddd_avx512f(auVar80,auVar79);
                            in_ZMM8 = vpgatherdd_avx512f(*(undefined4 *)
                                                          ((long)bottom_blob->data + (ulong)uVar30))
                            ;
                            auVar63 = vpmovdb_avx512f(in_ZMM8);
                            *(undefined1 (*) [16])*pauVar17 = auVar63;
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
                            uVar30 = uVar30 - 1;
                          } while (uVar30 != 0);
                        }
                      }
                      uVar30 = (int)uVar33 >> 3;
                      if (7 < (int)uVar55 && iVar50 == 8) {
                        do {
                          auVar80 = vpbroadcastd_avx512f();
                          auVar80 = vpaddd_avx512f(auVar80,auVar79);
                          auVar80 = vpslld_avx512f(auVar80,3);
                          auVar81 = vpgatherdq_avx512f(*(undefined4 *)
                                                        ((long)bottom_blob->data + (ulong)uVar30));
                          vextracti64x4_avx512f(auVar80,1);
                          auVar80 = vpgatherdq_avx512f(*(undefined4 *)
                                                        ((long)bottom_blob->data + (ulong)uVar30));
                          auVar82 = vpunpcklwd_avx512bw(auVar81,auVar80);
                          auVar80 = vpunpckhwd_avx512bw(auVar81,auVar80);
                          auVar81 = vpunpcklwd_avx512bw(auVar82,auVar80);
                          auVar80 = vpunpckhwd_avx512bw(auVar82,auVar80);
                          auVar82 = vshufi64x2_avx512f(auVar81,auVar80,0x88);
                          auVar80 = vshufi64x2_avx512f(auVar81,auVar80,0xdd);
                          auVar81 = vpunpckldq_avx512f(auVar82,auVar80);
                          auVar80 = vpunpckhdq_avx512f(auVar82,auVar80);
                          auVar82 = vshufi64x2_avx512f(auVar81,auVar80,0x88);
                          auVar80 = vshufi64x2_avx512f(auVar81,auVar80,0xdd);
                          auVar81 = vpunpcklqdq_avx512f(auVar82,auVar80);
                          auVar80 = vpunpckhqdq_avx512f(auVar82,auVar80);
                          in_ZMM8 = vinserti64x4_avx512f(auVar81,auVar80._0_32_,1);
                          auVar80 = vshufi64x2_avx512f(auVar81,auVar80,0xee);
                          in_ZMM9 = vshufi64x2_avx512f(in_ZMM8,auVar80,0x88);
                          auVar81 = vshufi64x2_avx512f(in_ZMM8,auVar80,0xdd);
                          auVar80 = vmovdqu64_avx512f(in_ZMM9);
                          *pauVar17 = auVar80;
                          auVar80 = vmovdqu64_avx512f(auVar81);
                          pauVar17[1] = auVar80;
                          pauVar17 = pauVar17 + 2;
                          uVar30 = uVar30 - 1;
                        } while (uVar30 != 0);
                      }
                    }
                    uVar30 = uVar22 + 0x10;
                    iVar16 = uVar22 + 0x1f;
                    uVar22 = uVar30;
                  } while (iVar16 < (int)uVar29);
                }
                if ((int)(uVar30 | 7) < (int)uVar29) {
                  auVar112._4_4_ = uVar35;
                  auVar112._0_4_ = uVar35;
                  auVar112._8_4_ = uVar35;
                  auVar112._12_4_ = uVar35;
                  auVar112._16_4_ = uVar35;
                  auVar112._20_4_ = uVar35;
                  auVar112._24_4_ = uVar35;
                  auVar112._28_4_ = uVar35;
                  auVar69 = vpbroadcastd_avx512vl();
                  auVar74 = vpbroadcastd_avx512vl();
                  iVar51 = iVar3 * dilation_h;
                  uVar33 = uVar55 + 7;
                  if (-1 < (int)uVar55) {
                    uVar33 = uVar55;
                  }
                  iVar34 = k + 7;
                  if (-1 < k) {
                    iVar34 = k;
                  }
                  uVar22 = uVar30;
                  do {
                    auVar76 = _DAT_005f3300;
                    auVar67 = vpbroadcastd_avx512vl();
                    auVar67 = vpaddd_avx2(auVar67,_DAT_005f4000);
                    auVar73 = vpmuludq_avx2(auVar67,auVar75._0_32_);
                    auVar116 = vpsrlq_avx2(auVar73,0x20);
                    auVar73 = vpsrlq_avx2(auVar67,0x20);
                    auVar73 = vpmuludq_avx2(auVar73,auVar75._0_32_);
                    auVar116 = vpblendd_avx2(auVar116,auVar73,0xaa);
                    auVar73 = vpsubd_avx2(auVar67,auVar116);
                    auVar73 = vpsrlvd_avx2(auVar73,auVar112);
                    auVar73 = vpaddd_avx2(auVar73,auVar116);
                    auVar116 = vpsrld_avx2(auVar73,auVar66);
                    auVar73 = vpmulld_avx2(auVar116,auVar69);
                    in_ZMM8 = ZEXT3264(auVar73);
                    auVar67 = vpsubd_avx2(auVar67,auVar73);
                    auVar67 = vpmulld_avx2(auVar67,local_78._0_32_);
                    auVar73 = vpmulld_avx2(auVar116,auVar74);
                    if (stride_w == 1) {
                      auVar63 = vpshufd_avx(auVar73._16_16_,0xff);
                      in_ZMM8 = ZEXT1664(auVar63);
                      uVar43 = vpcmpeqd_avx512vl(auVar73,ZEXT1632(auVar63));
                      if ((uVar43 & 1) == 0) goto LAB_001adc3e;
                      auVar63 = vpaddd_avx(auVar67._0_16_,auVar73._0_16_);
                      iVar16 = auVar63._0_4_;
                      if (iVar50 == 1) {
                        iVar15 = 0;
                        if (1 < (int)uVar55) {
                          iVar44 = 0;
                          do {
                            uVar43 = (long)(iVar44 + k) % (long)iVar59;
                            iVar15 = iVar44 + k + 1;
                            uVar38 = (long)iVar15 % (long)iVar59;
                            uVar43 = (ulong)(uint)((int)uVar43 >> 0x1f) << 0x20 |
                                     uVar43 & 0xffffffff;
                            uVar38 = (ulong)(uint)((int)uVar38 >> 0x1f) << 0x20 |
                                     uVar38 & 0xffffffff;
                            auVar63._8_8_ = 0;
                            auVar63._0_8_ =
                                 *(ulong *)((long)bottom_blob->data +
                                           (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w
                                                  + ((iVar44 + k) / iVar59) * iVar25 + iVar16 +
                                                 (int)((long)uVar43 / (long)kernel_w) * iVar51));
                            auVar64._8_8_ = 0;
                            auVar64._0_8_ =
                                 *(ulong *)((long)bottom_blob->data +
                                           (long)((int)((long)uVar38 % (long)kernel_w) * dilation_w
                                                  + (iVar15 / iVar59) * iVar25 + iVar16 +
                                                 (int)((long)uVar38 / (long)kernel_w) * iVar51));
                            auVar63 = vpunpcklbw_avx(auVar63,auVar64);
                            *(undefined1 (*) [16])*pauVar17 = auVar63;
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
                            iVar15 = iVar44 + 2;
                            iVar57 = iVar44 + 3;
                            iVar44 = iVar15;
                          } while (iVar57 < (int)uVar55);
                        }
                        iVar44 = uVar55 - iVar15;
                        if (iVar44 != 0 && iVar15 <= (int)uVar55) {
                          iVar15 = iVar15 + k;
                          do {
                            uVar43 = (ulong)(uint)((int)((long)iVar15 % (long)iVar59) >> 0x1f) <<
                                     0x20 | (long)iVar15 % (long)iVar59 & 0xffffffffU;
                            *(undefined8 *)*pauVar17 =
                                 *(undefined8 *)
                                  ((long)bottom_blob->data +
                                  (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                         (iVar15 / iVar59) * iVar25 + iVar16 +
                                        (int)((long)uVar43 / (long)kernel_w) * iVar51));
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 8);
                            iVar15 = iVar15 + 1;
                            iVar44 = iVar44 + -1;
                          } while (iVar44 != 0);
                        }
                      }
                      if (7 < (int)uVar55 && iVar50 == 8) {
                        auVar67 = vpmovsxbw_avx2(_DAT_005f2b20);
                        in_ZMM9 = ZEXT3264(auVar67);
                        auVar73 = vpmovsxbw_avx2(_DAT_005f2b30);
                        iVar15 = (int)uVar33 >> 3;
                        iVar44 = iVar34 >> 3;
                        do {
                          uVar43 = (ulong)(uint)((int)((long)iVar44 % (long)iVar59) >> 0x1f) << 0x20
                                   | (long)iVar44 % (long)iVar59 & 0xffffffffU;
                          lVar23 = (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                          (iVar44 / iVar59) * iVar25 + iVar16 +
                                         (int)((long)uVar43 / (long)kernel_w) * iVar51);
                          auVar116 = *(undefined1 (*) [32])((long)bottom_blob->data + lVar23 * 8);
                          auVar68 = *(undefined1 (*) [32])
                                     ((long)bottom_blob->data + lVar23 * 8 + 0x20);
                          auVar2 = vpunpcklwd_avx2(auVar116,auVar68);
                          auVar116 = vpunpckhwd_avx2(auVar116,auVar68);
                          auVar68 = vpermt2w_avx512vl(auVar2,auVar67,auVar116);
                          auVar116 = vpermt2w_avx512vl(auVar2,auVar73,auVar116);
                          in_ZMM8 = ZEXT3264(auVar116);
                          *(undefined1 (*) [32])*pauVar17 = auVar68;
                          *(undefined1 (*) [32])(*pauVar17 + 0x20) = auVar116;
                          pauVar17 = pauVar17 + 1;
                          iVar44 = iVar44 + 1;
                          iVar15 = iVar15 + -1;
                        } while (iVar15 != 0);
                      }
                    }
                    else {
LAB_001adc3e:
                      auVar67 = vpaddd_avx2(auVar67,auVar73);
                      if (iVar50 == 1) {
                        iVar16 = 0;
                        if (1 < (int)uVar55) {
                          iVar15 = 0;
                          do {
                            auVar73 = vpbroadcastd_avx512vl();
                            auVar73 = vpaddd_avx2(auVar73,auVar67);
                            auVar116 = vpbroadcastd_avx512vl();
                            vpaddd_avx2(auVar116,auVar67);
                            auVar116 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
                            auVar116 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                  auVar116);
                            auVar73 = vpcmpeqd_avx2(auVar73,auVar73);
                            auVar73 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar73)
                            ;
                            in_ZMM9 = ZEXT3264(auVar73);
                            auVar77 = vinserti64x4_avx512f(in_ZMM9,auVar73,1);
                            auVar78 = vinserti64x4_avx512f(ZEXT3264(auVar116),auVar116,1);
                            in_ZMM8 = vpermt2ps_avx512f(auVar78,auVar76,auVar77);
                            auVar63 = vpmovdb_avx512f(in_ZMM8);
                            *(undefined1 (*) [16])*pauVar17 = auVar63;
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
                            iVar16 = iVar15 + 2;
                            iVar44 = iVar15 + 3;
                            iVar15 = iVar16;
                          } while (iVar44 < (int)uVar55);
                        }
                        iVar15 = uVar55 - iVar16;
                        if (iVar15 != 0 && iVar16 <= (int)uVar55) {
                          do {
                            auVar116 = vpbroadcastd_avx512vl();
                            auVar73 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
                            vpaddd_avx2(auVar116,auVar67);
                            auVar73 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar73)
                            ;
                            in_ZMM9 = ZEXT3264(auVar73);
                            in_ZMM8 = ZEXT3264((undefined1  [32])0x0);
                            auVar63 = vpmovdb_avx512vl(auVar73);
                            *(long *)*pauVar17 = auVar63._0_8_;
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 8);
                            iVar15 = iVar15 + -1;
                          } while (iVar15 != 0);
                        }
                      }
                      if (7 < (int)uVar55 && iVar50 == 8) {
                        auVar73 = vpmovsxbw_avx2(_DAT_005f2b20);
                        auVar116 = vpmovsxbw_avx2(_DAT_005f2b30);
                        iVar16 = (int)uVar33 >> 3;
                        do {
                          auVar68 = vpbroadcastd_avx512vl();
                          auVar68 = vpaddd_avx2(auVar68,auVar67);
                          vpslld_avx2(auVar68,3);
                          auVar68 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
                          auVar117 = vpgatherdq(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar68);
                          auVar68 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
                          auVar68 = vpgatherdq(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar68);
                          auVar2 = vpunpcklwd_avx2(auVar117,auVar68);
                          auVar68 = vpunpckhwd_avx2(auVar117,auVar68);
                          in_ZMM8 = ZEXT3264(auVar68);
                          auVar117 = vpermt2w_avx512vl(auVar2,auVar73,auVar68);
                          in_ZMM9 = ZEXT3264(auVar117);
                          auVar68 = vpermt2w_avx512vl(auVar2,auVar116,auVar68);
                          *(undefined1 (*) [32])*pauVar17 = auVar117;
                          *(undefined1 (*) [32])(*pauVar17 + 0x20) = auVar68;
                          pauVar17 = pauVar17 + 1;
                          iVar16 = iVar16 + -1;
                        } while (iVar16 != 0);
                      }
                    }
                    uVar30 = uVar22 + 8;
                    iVar16 = uVar22 + 0xf;
                    uVar22 = uVar30;
                  } while (iVar16 < (int)uVar29);
                }
                if ((int)(uVar30 | 3) < (int)uVar29) {
                  auVar111._4_4_ = uVar35;
                  auVar111._0_4_ = uVar35;
                  auVar111._8_4_ = uVar35;
                  auVar111._12_4_ = uVar35;
                  auVar63 = vpbroadcastd_avx512vl();
                  auVar64 = vpbroadcastd_avx512vl();
                  iVar51 = iVar3 * dilation_h;
                  uVar35 = uVar55 + 7;
                  if (-1 < (int)uVar55) {
                    uVar35 = uVar55;
                  }
                  iVar34 = k + 7;
                  if (-1 < k) {
                    iVar34 = k;
                  }
                  uVar33 = uVar30;
                  do {
                    auVar65 = vpbroadcastd_avx512vl();
                    auVar65 = vpaddd_avx(auVar65,_DAT_005f25d0);
                    auVar115 = vpmuludq_avx(auVar65,auVar75._0_16_);
                    auVar113 = vpsrlq_avx(auVar115,0x20);
                    auVar115 = vpsrlq_avx(auVar65,0x20);
                    auVar115 = vpmuludq_avx(auVar115,auVar75._0_16_);
                    auVar113 = vpblendd_avx2(auVar113,auVar115,10);
                    auVar115 = vpsubd_avx(auVar65,auVar113);
                    auVar115 = vpsrlvd_avx2(auVar115,auVar111);
                    auVar115 = vpaddd_avx(auVar115,auVar113);
                    auVar113 = vpsrld_avx(auVar115,auVar66);
                    auVar115 = vpmulld_avx(auVar113,auVar63);
                    auVar76 = ZEXT1664(auVar115);
                    auVar65 = vpsubd_avx(auVar65,auVar115);
                    auVar65 = vpmulld_avx(auVar65,local_78._0_16_);
                    auVar115 = vpmulld_avx(auVar113,auVar64);
                    auVar65 = vpaddd_avx(auVar65,auVar115);
                    if ((stride_w == 1) && (auVar115._0_4_ == auVar115._12_4_)) {
                      iVar16 = auVar65._0_4_;
                      if (iVar50 == 1) {
                        iVar15 = 0;
                        if (1 < (int)uVar55) {
                          iVar44 = 0;
                          do {
                            uVar43 = (long)(iVar44 + k) % (long)iVar59;
                            iVar15 = iVar44 + k + 1;
                            uVar38 = (long)iVar15 % (long)iVar59;
                            uVar43 = (ulong)(uint)((int)uVar43 >> 0x1f) << 0x20 |
                                     uVar43 & 0xffffffff;
                            uVar38 = (ulong)(uint)((int)uVar38 >> 0x1f) << 0x20 |
                                     uVar38 & 0xffffffff;
                            auVar65._8_8_ = 0;
                            auVar65._0_8_ =
                                 *(ulong *)((long)bottom_blob->data +
                                           (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w
                                                  + ((iVar44 + k) / iVar59) * iVar25 + iVar16 +
                                                 (int)((long)uVar43 / (long)kernel_w) * iVar51));
                            auVar115._8_8_ = 0;
                            auVar115._0_8_ =
                                 *(ulong *)((long)bottom_blob->data +
                                           (long)((int)((long)uVar38 % (long)kernel_w) * dilation_w
                                                  + (iVar15 / iVar59) * iVar25 + iVar16 +
                                                 (int)((long)uVar38 / (long)kernel_w) * iVar51));
                            auVar65 = vpunpcklbw_avx(auVar65,auVar115);
                            *(long *)*pauVar17 = auVar65._0_8_;
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 8);
                            iVar15 = iVar44 + 2;
                            iVar57 = iVar44 + 3;
                            iVar44 = iVar15;
                          } while (iVar57 < (int)uVar55);
                        }
                        iVar44 = uVar55 - iVar15;
                        if (iVar44 != 0 && iVar15 <= (int)uVar55) {
                          iVar15 = iVar15 + k;
                          do {
                            uVar43 = (ulong)(uint)((int)((long)iVar15 % (long)iVar59) >> 0x1f) <<
                                     0x20 | (long)iVar15 % (long)iVar59 & 0xffffffffU;
                            lVar23 = (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                            (iVar15 / iVar59) * iVar25 + iVar16 +
                                           (int)((long)uVar43 / (long)kernel_w) * iVar51);
                            (*pauVar17)[0] = *(undefined1 *)((long)bottom_blob->data + lVar23);
                            (*pauVar17)[1] = *(undefined1 *)((long)bottom_blob->data + lVar23 + 1);
                            (*pauVar17)[2] = *(undefined1 *)((long)bottom_blob->data + lVar23 + 2);
                            (*pauVar17)[3] = *(undefined1 *)((long)bottom_blob->data + lVar23 + 3);
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 4);
                            iVar15 = iVar15 + 1;
                            iVar44 = iVar44 + -1;
                          } while (iVar44 != 0);
                        }
                      }
                      iVar15 = iVar34 >> 3;
                      iVar44 = (int)uVar35 >> 3;
                      if (7 < (int)uVar55 && iVar50 == 8) {
                        do {
                          uVar43 = (ulong)(uint)((int)((long)iVar15 % (long)iVar59) >> 0x1f) << 0x20
                                   | (long)iVar15 % (long)iVar59 & 0xffffffffU;
                          lVar23 = (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                          (iVar15 / iVar59) * iVar25 + iVar16 +
                                         (int)((long)uVar43 / (long)kernel_w) * iVar51);
                          auVar65 = *(undefined1 (*) [16])((long)bottom_blob->data + lVar23 * 8);
                          auVar115 = *(undefined1 (*) [16])
                                      ((long)bottom_blob->data + lVar23 * 8 + 0x10);
                          auVar113 = vpunpcklwd_avx(auVar65,auVar115);
                          auVar65 = vpunpckhwd_avx(auVar65,auVar115);
                          auVar115 = vpunpcklwd_avx(auVar113,auVar65);
                          auVar65 = vpunpckhwd_avx(auVar113,auVar65);
                          *(undefined1 (*) [16])*pauVar17 = auVar115;
                          *(undefined1 (*) [16])(*pauVar17 + 0x10) = auVar65;
                          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
                          iVar44 = iVar44 + -1;
                          iVar15 = iVar15 + 1;
                        } while (iVar44 != 0);
                      }
                    }
                    else {
                      if (iVar50 == 1) {
                        iVar16 = 0;
                        if (1 < (int)uVar55) {
                          auVar69 = vpmovsxbd_avx2(ZEXT816(0xb030a0209010800));
                          iVar15 = 0;
                          do {
                            auVar115 = vpbroadcastd_avx512vl();
                            auVar115 = vpaddd_avx(auVar115,auVar65);
                            auVar113 = vpbroadcastd_avx512vl();
                            auVar113 = vpaddd_avx(auVar113,auVar65);
                            auVar76 = ZEXT1664(auVar113);
                            auVar113 = vpcmpeqd_avx(in_ZMM8._0_16_,in_ZMM8._0_16_);
                            auVar113 = vpgatherdd((undefined1  [16])0x0,auVar113);
                            auVar115 = vpcmpeqd_avx(auVar115,auVar115);
                            auVar115 = vpgatherdd((undefined1  [16])0x0,auVar115);
                            in_ZMM8 = ZEXT1664(auVar115);
                            auVar74 = vpermt2d_avx512vl(ZEXT1632(auVar113),auVar69,
                                                        ZEXT1632(auVar115));
                            in_ZMM9 = ZEXT3264(auVar74);
                            auVar115 = vpmovdb_avx512vl(auVar74);
                            *(long *)*pauVar17 = auVar115._0_8_;
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 8);
                            iVar16 = iVar15 + 2;
                            iVar44 = iVar15 + 3;
                            iVar15 = iVar16;
                          } while (iVar44 < (int)uVar55);
                        }
                        iVar15 = uVar55 - iVar16;
                        if (iVar15 != 0 && iVar16 <= (int)uVar55) {
                          do {
                            auVar113 = vpbroadcastd_avx512vl();
                            auVar115 = vpcmpeqd_avx(auVar76._0_16_,auVar76._0_16_);
                            vpaddd_avx(auVar113,auVar65);
                            auVar115 = vpgatherdd((undefined1  [16])0x0,auVar115);
                            in_ZMM8 = ZEXT1664(auVar115);
                            auVar76 = ZEXT1664((undefined1  [16])0x0);
                            auVar115 = vpmovdb_avx512vl(auVar115);
                            *(int *)*pauVar17 = auVar115._0_4_;
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 4);
                            iVar15 = iVar15 + -1;
                          } while (iVar15 != 0);
                        }
                      }
                      iVar16 = (int)uVar35 >> 3;
                      if (7 < (int)uVar55 && iVar50 == 8) {
                        do {
                          auVar115 = vpbroadcastd_avx512vl();
                          auVar115 = vpaddd_avx(auVar115,auVar65);
                          vpslld_avx(auVar115,3);
                          auVar69 = vpcmpeqd_avx2(auVar76._0_32_,auVar76._0_32_);
                          auVar74 = vpgatherdq(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar69);
                          in_ZMM8 = ZEXT3264(auVar74);
                          auVar76 = ZEXT3264((undefined1  [32])0x0);
                          auVar69 = vpmovsxbw_avx2(_DAT_005f2b40);
                          auVar69 = vpermw_avx512vl(auVar69,auVar74);
                          *(undefined1 (*) [32])*pauVar17 = auVar69;
                          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
                          iVar16 = iVar16 + -1;
                        } while (iVar16 != 0);
                      }
                    }
                    uVar30 = uVar33 + 4;
                    iVar16 = uVar33 + 7;
                    uVar33 = uVar30;
                  } while (iVar16 < (int)uVar29);
                }
                if ((int)(uVar30 | 1) < (int)uVar29) {
                  iVar51 = iVar3 * dilation_h;
                  uVar35 = uVar55 + 7;
                  if (-1 < (int)uVar55) {
                    uVar35 = uVar55;
                  }
                  iVar16 = (int)uVar35 >> 3;
                  iVar34 = k + 7;
                  if (-1 < k) {
                    iVar34 = k;
                  }
                  local_27c = CONCAT31(local_27c._1_3_,(int)uVar55 < 8 || iVar50 != 8);
                  uVar35 = uVar30;
                  do {
                    iVar15 = uVar35 + iVar47 + 1;
                    iVar45 = ((int)(uVar35 + iVar47) / iVar56) * iVar3 * stride_h;
                    iVar44 = (iVar15 / iVar56) * iVar3 * stride_h;
                    iVar57 = ((int)(uVar35 + iVar47) % iVar56) * stride_w + iVar45;
                    if ((stride_w == 1) && (iVar45 == iVar44)) {
                      if (iVar50 == 1) {
                        iVar15 = 0;
                        if (1 < (int)uVar55) {
                          iVar44 = 0;
                          do {
                            uVar43 = (long)(iVar44 + k) % (long)iVar59;
                            iVar15 = iVar44 + k + 1;
                            uVar38 = (long)iVar15 % (long)iVar59;
                            uVar43 = (ulong)(uint)((int)uVar43 >> 0x1f) << 0x20 |
                                     uVar43 & 0xffffffff;
                            uVar38 = (ulong)(uint)((int)uVar38 >> 0x1f) << 0x20 |
                                     uVar38 & 0xffffffff;
                            pvVar7 = bottom_blob->data;
                            lVar21 = (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                            ((iVar44 + k) / iVar59) * iVar25 + iVar57 +
                                           (int)((long)uVar43 / (long)kernel_w) * iVar51);
                            lVar23 = (long)((int)((long)uVar38 % (long)kernel_w) * dilation_w +
                                            (iVar15 / iVar59) * iVar25 + iVar57 +
                                           (int)((long)uVar38 / (long)kernel_w) * iVar51);
                            (*pauVar17)[0] = *(undefined1 *)((long)pvVar7 + lVar21);
                            (*pauVar17)[1] = *(undefined1 *)((long)pvVar7 + lVar23);
                            (*pauVar17)[2] = *(undefined1 *)((long)pvVar7 + lVar21 + 1);
                            (*pauVar17)[3] = *(undefined1 *)((long)pvVar7 + lVar23 + 1);
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 4);
                            iVar15 = iVar44 + 2;
                            iVar45 = iVar44 + 3;
                            iVar44 = iVar15;
                          } while (iVar45 < (int)uVar55);
                        }
                        iVar44 = uVar55 - iVar15;
                        if (iVar44 != 0 && iVar15 <= (int)uVar55) {
                          iVar15 = iVar15 + k;
                          do {
                            uVar43 = (ulong)(uint)((int)((long)iVar15 % (long)iVar59) >> 0x1f) <<
                                     0x20 | (long)iVar15 % (long)iVar59 & 0xffffffffU;
                            pvVar7 = bottom_blob->data;
                            lVar23 = (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                            (iVar15 / iVar59) * iVar25 + iVar57 +
                                           (int)((long)uVar43 / (long)kernel_w) * iVar51);
                            (*pauVar17)[0] = *(undefined1 *)((long)pvVar7 + lVar23);
                            (*pauVar17)[1] = *(undefined1 *)((long)pvVar7 + lVar23 + 1);
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 2);
                            iVar15 = iVar15 + 1;
                            iVar44 = iVar44 + -1;
                          } while (iVar44 != 0);
                        }
                      }
                      iVar15 = iVar34 >> 3;
                      iVar44 = iVar16;
                      if ((int)uVar55 >= 8 && iVar50 == 8) {
                        do {
                          uVar43 = (ulong)(uint)((int)((long)iVar15 % (long)iVar59) >> 0x1f) << 0x20
                                   | (long)iVar15 % (long)iVar59 & 0xffffffffU;
                          auVar66 = vpshufb_avx(*(undefined1 (*) [16])
                                                 ((long)bottom_blob->data +
                                                 (long)((int)((long)uVar43 % (long)kernel_w) *
                                                        dilation_w +
                                                        (iVar15 / iVar59) * iVar25 + iVar57 +
                                                       (int)((long)uVar43 / (long)kernel_w) * iVar51
                                                       ) * 8),_DAT_005f2af0);
                          *(undefined1 (*) [16])*pauVar17 = auVar66;
                          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
                          iVar44 = iVar44 + -1;
                          iVar15 = iVar15 + 1;
                        } while (iVar44 != 0);
                      }
                    }
                    else {
                      iVar44 = (iVar15 % iVar56) * stride_w + iVar44;
                      uVar30 = 0;
                      if (iVar50 == 1) {
                        uVar30 = 0;
                        if (1 < (int)uVar55) {
                          uVar33 = 0;
                          do {
                            uVar43 = (long)(int)(uVar33 + k) % (long)iVar59;
                            iVar15 = uVar33 + k + 1;
                            uVar38 = (long)iVar15 % (long)iVar59;
                            uVar43 = (ulong)(uint)((int)uVar43 >> 0x1f) << 0x20 |
                                     uVar43 & 0xffffffff;
                            iVar45 = (int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                     ((int)(uVar33 + k) / iVar59) * iVar25 +
                                     (int)((long)uVar43 / (long)kernel_w) * iVar51;
                            uVar43 = (ulong)(uint)((int)uVar38 >> 0x1f) << 0x20 |
                                     uVar38 & 0xffffffff;
                            iVar15 = (int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                     (iVar15 / iVar59) * iVar25 +
                                     (int)((long)uVar43 / (long)kernel_w) * iVar51;
                            pvVar7 = bottom_blob->data;
                            (*pauVar17)[0] = *(undefined1 *)((long)pvVar7 + (long)(iVar45 + iVar57))
                            ;
                            (*pauVar17)[1] = *(undefined1 *)((long)pvVar7 + (long)(iVar15 + iVar57))
                            ;
                            (*pauVar17)[2] = *(undefined1 *)((long)pvVar7 + (long)(iVar45 + iVar44))
                            ;
                            (*pauVar17)[3] = *(undefined1 *)((long)pvVar7 + (long)(iVar15 + iVar44))
                            ;
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 4);
                            uVar30 = uVar33 + 2;
                            iVar15 = uVar33 + 3;
                            uVar33 = uVar30;
                          } while (iVar15 < (int)uVar55);
                        }
                        iVar15 = uVar55 - uVar30;
                        if (iVar15 != 0 && (int)uVar30 <= (int)uVar55) {
                          iVar45 = uVar30 + k;
                          do {
                            uVar43 = (ulong)(uint)((int)((long)iVar45 % (long)iVar59) >> 0x1f) <<
                                     0x20 | (long)iVar45 % (long)iVar59 & 0xffffffffU;
                            iVar26 = (int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                     (iVar45 / iVar59) * iVar25 +
                                     (int)((long)uVar43 / (long)kernel_w) * iVar51;
                            pvVar7 = bottom_blob->data;
                            (*pauVar17)[0] = *(undefined1 *)((long)pvVar7 + (long)(iVar26 + iVar57))
                            ;
                            (*pauVar17)[1] = *(undefined1 *)((long)pvVar7 + (long)(iVar26 + iVar44))
                            ;
                            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 2);
                            iVar45 = iVar45 + 1;
                            iVar15 = iVar15 + -1;
                            uVar30 = uVar55;
                          } while (iVar15 != 0);
                        }
                      }
                      if ((iVar50 == 8) &&
                         (iVar15 = iVar16 - uVar30, iVar15 != 0 && (int)uVar30 <= iVar16)) {
                        iVar45 = uVar30 + (iVar34 >> 3);
                        do {
                          uVar43 = (ulong)(uint)((int)((long)iVar45 % (long)iVar59) >> 0x1f) << 0x20
                                   | (long)iVar45 % (long)iVar59 & 0xffffffffU;
                          iVar26 = (int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                   (iVar45 / iVar59) * iVar25 +
                                   (int)((long)uVar43 / (long)kernel_w) * iVar51;
                          auVar66._8_8_ = 0;
                          auVar66._0_8_ =
                               *(ulong *)((long)bottom_blob->data + (long)(iVar26 + iVar57) * 8);
                          auVar113._8_8_ = 0;
                          auVar113._0_8_ =
                               *(ulong *)((long)bottom_blob->data + (long)(iVar26 + iVar44) * 8);
                          auVar66 = vpunpcklwd_avx(auVar66,auVar113);
                          *(undefined1 (*) [16])*pauVar17 = auVar66;
                          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
                          iVar45 = iVar45 + 1;
                          iVar15 = iVar15 + -1;
                        } while (iVar15 != 0);
                      }
                    }
                    uVar30 = uVar35 + 2;
                    iVar15 = uVar35 + 3;
                    uVar35 = uVar30;
                  } while (iVar15 < (int)uVar29);
                }
                if ((int)uVar30 < (int)uVar29) {
                  iVar51 = iVar3 * dilation_h;
                  uVar35 = uVar55 + 7;
                  if (-1 < (int)uVar55) {
                    uVar35 = uVar55;
                  }
                  iVar34 = k + 7;
                  if (-1 < k) {
                    iVar34 = k;
                  }
                  do {
                    iVar16 = ((int)(iVar47 + uVar30) / iVar56) * iVar3 * stride_h +
                             ((int)(iVar47 + uVar30) % iVar56) * stride_w;
                    if (iVar50 == 1) {
                      lVar23 = 0;
                      if (1 < (int)uVar55) {
                        lVar23 = 0;
                        do {
                          iVar15 = (int)lVar23;
                          uVar43 = (long)(k + iVar15) % (long)iVar59;
                          iVar44 = k + iVar15 + 1;
                          uVar38 = (long)iVar44 % (long)iVar59;
                          uVar43 = (ulong)(uint)((int)uVar43 >> 0x1f) << 0x20 | uVar43 & 0xffffffff;
                          uVar38 = (ulong)(uint)((int)uVar38 >> 0x1f) << 0x20 | uVar38 & 0xffffffff;
                          pvVar7 = bottom_blob->data;
                          (*pauVar17)[lVar23] =
                               *(undefined1 *)
                                ((long)pvVar7 +
                                (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                       ((k + iVar15) / iVar59) * iVar25 + iVar16 +
                                      (int)((long)uVar43 / (long)kernel_w) * iVar51));
                          (*pauVar17)[lVar23 + 1] =
                               *(undefined1 *)
                                ((long)pvVar7 +
                                (long)((int)((long)uVar38 % (long)kernel_w) * dilation_w +
                                       (iVar44 / iVar59) * iVar25 + iVar16 +
                                      (int)((long)uVar38 / (long)kernel_w) * iVar51));
                          lVar23 = lVar23 + 2;
                        } while (iVar15 + 3 < (int)uVar55);
                        pauVar17 = (undefined1 (*) [64])(*pauVar17 + lVar23);
                      }
                      iVar15 = (int)lVar23;
                      iVar44 = uVar55 - iVar15;
                      if (iVar44 != 0 && iVar15 <= (int)uVar55) {
                        iVar15 = iVar15 + k;
                        do {
                          uVar43 = (ulong)(uint)((int)((long)iVar15 % (long)iVar59) >> 0x1f) << 0x20
                                   | (long)iVar15 % (long)iVar59 & 0xffffffffU;
                          (*pauVar17)[0] =
                               *(undefined1 *)
                                ((long)bottom_blob->data +
                                (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                       (iVar15 / iVar59) * iVar25 + iVar16 +
                                      (int)((long)uVar43 / (long)kernel_w) * iVar51));
                          pauVar17 = (undefined1 (*) [64])(*pauVar17 + 1);
                          iVar15 = iVar15 + 1;
                          iVar44 = iVar44 + -1;
                        } while (iVar44 != 0);
                      }
                    }
                    iVar15 = (int)uVar35 >> 3;
                    iVar44 = iVar34 >> 3;
                    if (7 < (int)uVar55 && iVar50 == 8) {
                      do {
                        uVar43 = (ulong)(uint)((int)((long)iVar44 % (long)iVar59) >> 0x1f) << 0x20 |
                                 (long)iVar44 % (long)iVar59 & 0xffffffffU;
                        *(undefined8 *)*pauVar17 =
                             *(undefined8 *)
                              ((long)bottom_blob->data +
                              (long)((int)((long)uVar43 % (long)kernel_w) * dilation_w +
                                     (iVar44 / iVar59) * iVar25 + iVar16 +
                                    (int)((long)uVar43 / (long)kernel_w) * iVar51) * 8);
                        pauVar17 = (undefined1 (*) [64])(*pauVar17 + 8);
                        iVar15 = iVar15 + -1;
                        iVar44 = iVar44 + 1;
                      } while (iVar15 != 0);
                    }
                    uVar30 = uVar30 + 1;
                  } while (uVar30 != uVar29);
                }
              }
            }
            else {
              convolution_im2col_input_tile_int8_avxvnni
                        (bottom_blob,&local_258,iVar47,uVar29,k,uVar55,kernel_w,(int)local_270,
                         dilation_w,dilation_h,stride_w,stride_h);
            }
          }
          else {
            convolution_im2col_input_tile_int8_avxvnniint8
                      (bottom_blob,&local_258,iVar47,uVar29,k,uVar55,kernel_w,(int)local_270,
                       dilation_w,dilation_h,stride_w,stride_h);
          }
        }
        else {
          convolution_im2col_input_tile_int8_avx512vnni
                    (bottom_blob,&local_258,iVar47,uVar29,k,uVar55,kernel_w,(int)local_270,
                     dilation_w,dilation_h,stride_w,stride_h);
        }
        piVar13 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_258.allocator == (Allocator *)0x0) {
              if ((undefined1 (*) [64])local_258.data != (undefined1 (*) [64])0x0) {
                in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                free(local_258.data);
              }
            }
            else {
              in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
              in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
              (*(local_258.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        uVar29 = (int)local_268 + 1;
        uVar43 = (ulong)uVar29;
      } while (uVar29 != (uint)local_1e8);
    }
    local_258.cstep = 0;
    local_258.data = (void *)0x0;
    local_258.refcount._0_4_ = 0;
    local_258.refcount._4_4_ = 0;
    local_258.elemsize = 0;
    local_258.elempack = 0;
    local_258.allocator = (Allocator *)0x0;
    local_258.dims = 0;
    local_258.w = 0;
    local_258.h = 0;
    local_258.d = 0;
    local_258.c = 0;
    Mat::create(&local_258,TILE_M * TILE_N,1,nT,4,opt->workspace_allocator);
    iVar31 = -100;
    if ((local_258.data != (void *)0x0) && ((long)local_258.c * local_258.cstep != 0)) {
      if (0 < local_204) {
        iVar31 = 0;
        uVar43 = local_1f0;
        do {
          local_270 = CONCAT44(local_270._4_4_,TILE_M * iVar31);
          uVar29 = (int)local_88 - TILE_M * iVar31;
          if (TILE_M < (int)uVar29) {
            uVar29 = TILE_M;
          }
          iVar24 = get_omp_thread_num();
          m.data = (void *)((long)iVar24 * local_258.cstep * local_258.elemsize +
                           (long)local_258.data);
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize = local_258.elemsize;
          m.elempack = local_258.elempack;
          m.allocator = local_258.allocator;
          auVar14._4_4_ = m.h;
          auVar14._8_4_ = m.d;
          auVar14._0_4_ = local_258.w;
          m._40_8_ = auVar14._0_8_ << 0x20;
          m.h = local_258.h;
          m.d = 1;
          m.c = local_258.d;
          m.dims = local_258.dims + -1;
          m.cstep = (local_258.elemsize * (long)local_258.h * (long)local_258.w + 0xf &
                    0xfffffffffffffff0) / local_258.elemsize;
          if (local_258.dims == 4) {
            m.cstep = (long)local_258.h * (long)local_258.w;
          }
          auVar75 = vpmovsxbd_avx512f(_DAT_005f2b50);
          if (0 < N) {
            lVar23 = (long)(int)local_270;
            local_268 = (ulong)(int)uVar29;
            iVar24 = 0;
            do {
              uVar55 = N - iVar24;
              if (TILE_N < N - iVar24) {
                uVar55 = TILE_N;
              }
              iVar50 = (int)uVar43;
              if (0 < iVar50) {
                iVar59 = 0;
                do {
                  iVar47 = iVar50 - iVar59;
                  if (TILE_K < iVar50 - iVar59) {
                    iVar47 = TILE_K;
                  }
                  local_a8 = (size_t)local_80->w;
                  local_e8._16_8_ = local_80->elemsize;
                  local_e8._24_4_ = local_80->elempack;
                  local_e8._32_8_ = local_80->allocator;
                  local_e8._0_8_ =
                       (long)local_80->data +
                       local_e8._16_8_ * local_a8 * (long)(iVar59 / TILE_K) +
                       (long)((int)local_270 / TILE_M) * local_80->cstep * local_e8._16_8_;
                  local_e8._8_4_ = 0;
                  local_e8._12_4_ = 0;
                  iStack_bc = local_80->w;
                  local_e8._40_4_ = 2;
                  uStack_b8 = 0x100000001;
                  local_b0 = 1;
                  local_f8 = (size_t)local_1d8.w;
                  local_138._0_8_ =
                       (long)local_1d8.data +
                       local_1d8.elemsize * local_f8 * (long)(iVar59 / TILE_K) +
                       (long)(iVar24 / TILE_N) * local_1d8.cstep * local_1d8.elemsize;
                  local_138._8_4_ = 0;
                  local_138._12_4_ = 0;
                  local_138._16_8_ = local_1d8.elemsize;
                  local_138._24_4_ = local_1d8.elempack;
                  local_138._32_8_ = local_1d8.allocator;
                  iStack_10c = local_1d8.w;
                  local_138._40_4_ = 2;
                  uStack_108 = 0x100000001;
                  local_100 = 1;
                  Gemm_x86_avx512_utility::gemm_transB_packed_tile_int8
                            ((Mat *)local_e8,(Mat *)local_138,&m,(int)local_270,uVar29,iVar24,uVar55
                             ,iVar59,iVar47);
                  piVar13 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
                  if (piVar13 != (int *)0x0) {
                    LOCK();
                    *piVar13 = *piVar13 + -1;
                    UNLOCK();
                    if (*piVar13 == 0) {
                      if ((Allocator *)local_138._32_8_ == (Allocator *)0x0) {
                        if ((void *)local_138._0_8_ != (void *)0x0) {
                          free((void *)local_138._0_8_);
                        }
                      }
                      else {
                        (*(*(_func_int ***)local_138._32_8_)[3])();
                      }
                    }
                  }
                  local_f8 = 0;
                  local_138._0_8_ = (void *)0x0;
                  local_138._8_4_ = 0;
                  local_138._12_4_ = 0;
                  local_138._16_8_ = 0;
                  local_138._24_4_ = 0;
                  stack0xfffffffffffffef0 = (undefined1  [16])0x0;
                  local_100 = 0;
                  piVar13 = (int *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
                  auVar75 = vpmovsxbd_avx512f(_DAT_005f2b50);
                  if (piVar13 != (int *)0x0) {
                    LOCK();
                    *piVar13 = *piVar13 + -1;
                    UNLOCK();
                    if (*piVar13 == 0) {
                      if ((Allocator *)local_e8._32_8_ == (Allocator *)0x0) {
                        if ((void *)local_e8._0_8_ != (void *)0x0) {
                          free((void *)local_e8._0_8_);
                          auVar75 = vpmovsxbd_avx512f(_DAT_005f2b50);
                        }
                      }
                      else {
                        (*(*(_func_int ***)local_e8._32_8_)[3])();
                        auVar75 = vpmovsxbd_avx512f(_DAT_005f2b50);
                      }
                    }
                  }
                  local_a8 = 0;
                  local_e8._0_8_ = (void *)0x0;
                  local_e8._8_4_ = 0;
                  local_e8._12_4_ = 0;
                  local_e8._16_8_ = 0;
                  local_e8._24_4_ = 0;
                  stack0xffffffffffffff40 = (undefined1  [16])0x0;
                  local_b0 = 0;
                  iVar59 = iVar59 + TILE_K;
                } while (iVar59 < iVar50);
              }
              lVar21 = 0;
              iVar50 = local_260->elempack;
              sVar6 = local_260->cstep;
              iVar59 = (int)sVar6;
              pauVar17 = (undefined1 (*) [64])m.data;
              if (0xf < (int)uVar29) {
                local_1e8 = (long)(iVar50 * iVar24);
                lVar46 = (long)(iVar59 * 8);
                lVar48 = (long)(iVar59 * 4);
                lVar49 = (long)((sVar6 << 0x22) * 3) >> 0x20;
                lVar18 = (long)(iVar59 * 2);
                lVar39 = (long)(sVar6 * 0x300000000) >> 0x20;
                lVar40 = (long)(sVar6 * 0x500000000) >> 0x20;
                lVar41 = (long)(sVar6 * 0x600000000) >> 0x20;
                lVar42 = (long)(sVar6 * 0x700000000) >> 0x20;
                lVar19 = (long)((sVar6 << 0x20) * 9) >> 0x20;
                lVar20 = (long)((sVar6 << 0x21) * 5) >> 0x20;
                lVar61 = (long)(sVar6 * 0xb00000000) >> 0x20;
                lVar58 = (long)(sVar6 * 0xd00000000) >> 0x20;
                lVar52 = (long)(sVar6 * 0xe00000000) >> 0x20;
                lVar53 = (long)(sVar6 * 0xf00000000) >> 0x20;
                auVar76 = vpbroadcastd_avx512f();
                auVar76 = vpmulld_avx512f(auVar76,_DAT_005f3240);
                lVar60 = (long)iVar59;
                lVar54 = 0;
                do {
                  local_78._0_8_ = lVar54;
                  pauVar32 = (undefined1 (*) [64])
                             ((long)local_260->data + local_1e8 * 4 + (lVar23 + lVar54) * lVar60 * 4
                             );
                  uVar35 = 0;
                  if (0xf < (int)uVar55) {
                    iVar47 = 0xf;
                    do {
                      pauVar28 = pauVar17;
                      auVar77 = vmovdqa64_avx512f(*pauVar28);
                      auVar78 = vmovdqa64_avx512f(pauVar28[2]);
                      auVar79 = vmovdqa64_avx512f(pauVar28[4]);
                      auVar80 = vmovdqa64_avx512f(pauVar28[6]);
                      auVar81 = vmovdqa64_avx512f(pauVar28[8]);
                      auVar82 = vmovdqa64_avx512f(pauVar28[10]);
                      auVar83 = vmovdqa64_avx512f(pauVar28[0xc]);
                      auVar84 = vpshufd_avx512f(pauVar28[1],0x93);
                      auVar85 = vpshufd_avx512f(pauVar28[3],0x93);
                      auVar86 = vpshufd_avx512f(pauVar28[5],0x93);
                      auVar87 = vpshufd_avx512f(pauVar28[7],0x93);
                      auVar88 = vpshufd_avx512f(pauVar28[9],0x93);
                      auVar89 = vpshufd_avx512f(pauVar28[0xb],0x93);
                      auVar90 = vpshufd_avx512f(pauVar28[0xd],0x93);
                      auVar91 = vmovdqa64_avx512f(pauVar28[0xe]);
                      auVar92 = vpshufd_avx512f(pauVar28[0xf],0x93);
                      auVar93 = vpunpckldq_avx512f(auVar77,auVar85);
                      auVar77 = vpunpckhdq_avx512f(auVar77,auVar85);
                      auVar85 = vpunpckldq_avx512f(auVar78,auVar84);
                      auVar78 = vpunpckhdq_avx512f(auVar78,auVar84);
                      auVar84 = vpunpckldq_avx512f(auVar79,auVar87);
                      auVar79 = vpunpckhdq_avx512f(auVar79,auVar87);
                      auVar87 = vpunpckldq_avx512f(auVar80,auVar86);
                      auVar80 = vpunpckhdq_avx512f(auVar80,auVar86);
                      auVar86 = vpunpckldq_avx512f(auVar81,auVar89);
                      auVar81 = vpunpckhdq_avx512f(auVar81,auVar89);
                      auVar89 = vpunpckldq_avx512f(auVar82,auVar88);
                      auVar82 = vpunpckhdq_avx512f(auVar82,auVar88);
                      auVar88 = vpunpckldq_avx512f(auVar83,auVar92);
                      auVar83 = vpunpckhdq_avx512f(auVar83,auVar92);
                      auVar92 = vpunpckldq_avx512f(auVar91,auVar90);
                      auVar90 = vpunpckhdq_avx512f(auVar91,auVar90);
                      auVar91 = vpunpcklqdq_avx512f(auVar93,auVar85);
                      auVar94 = vpunpcklqdq_avx512f(auVar78,auVar77);
                      auVar95 = vpunpcklqdq_avx512f(auVar84,auVar87);
                      auVar96 = vpunpcklqdq_avx512f(auVar80,auVar79);
                      auVar97 = vpunpcklqdq_avx512f(auVar86,auVar89);
                      auVar98 = vpunpcklqdq_avx512f(auVar82,auVar81);
                      auVar99 = vpunpcklqdq_avx512f(auVar88,auVar92);
                      auVar100 = vpunpcklqdq_avx512f(auVar90,auVar83);
                      auVar85 = vpermt2d_avx512f(auVar85,auVar75,auVar93);
                      auVar77 = vpermt2d_avx512f(auVar77,auVar75,auVar78);
                      auVar78 = vpermt2d_avx512f(auVar87,auVar75,auVar84);
                      auVar79 = vpermt2d_avx512f(auVar79,auVar75,auVar80);
                      auVar80 = vpermt2d_avx512f(auVar89,auVar75,auVar86);
                      auVar81 = vpermt2d_avx512f(auVar81,auVar75,auVar82);
                      auVar82 = vpermt2d_avx512f(auVar92,auVar75,auVar88);
                      auVar83 = vpermt2d_avx512f(auVar83,auVar75,auVar90);
                      auVar84 = vshufi64x2_avx512f(auVar91,auVar97,0x88);
                      auVar86 = vshufi64x2_avx512f(auVar85,auVar80,0x88);
                      auVar87 = vshufi64x2_avx512f(auVar94,auVar98,0x88);
                      auVar88 = vshufi64x2_avx512f(auVar77,auVar81,0x88);
                      auVar89 = vshufi64x2_avx512f(auVar97,auVar91,0xdd);
                      auVar80 = vshufi64x2_avx512f(auVar80,auVar85,0xdd);
                      auVar85 = vshufi64x2_avx512f(auVar98,auVar94,0xdd);
                      auVar77 = vshufi64x2_avx512f(auVar81,auVar77,0xdd);
                      auVar81 = vshufi64x2_avx512f(auVar95,auVar99,0x88);
                      auVar90 = vshufi64x2_avx512f(auVar78,auVar82,0x88);
                      auVar91 = vshufi64x2_avx512f(auVar96,auVar100,0x88);
                      auVar92 = vshufi64x2_avx512f(auVar79,auVar83,0x88);
                      auVar93 = vshufi64x2_avx512f(auVar99,auVar95,0xdd);
                      auVar78 = vshufi64x2_avx512f(auVar82,auVar78,0xdd);
                      auVar82 = vshufi64x2_avx512f(auVar100,auVar96,0xdd);
                      auVar79 = vshufi64x2_avx512f(auVar83,auVar79,0xdd);
                      auVar83 = vshufi64x2_avx512f(auVar84,auVar81,0xd8);
                      auVar94 = vshufi64x2_avx512f(auVar86,auVar90,0xd8);
                      auVar95 = vshufi64x2_avx512f(auVar87,auVar91,0xd8);
                      auVar96 = vshufi64x2_avx512f(auVar88,auVar92,0xd8);
                      auVar97 = vshufi64x2_avx512f(auVar89,auVar93,0xd8);
                      auVar98 = vshufi64x2_avx512f(auVar80,auVar78,0xd8);
                      auVar99 = vshufi64x2_avx512f(auVar85,auVar82,0xd8);
                      auVar100 = vshufi64x2_avx512f(auVar77,auVar79,0xd8);
                      auVar81 = vshufi64x2_avx512f(auVar81,auVar84,0xd8);
                      auVar84 = vshufi64x2_avx512f(auVar90,auVar86,0xd8);
                      auVar86 = vshufi64x2_avx512f(auVar91,auVar87,0xd8);
                      auVar87 = vshufi64x2_avx512f(auVar92,auVar88,0xd8);
                      auVar88 = vshufi64x2_avx512f(auVar93,auVar89,0xd8);
                      auVar78 = vshufi64x2_avx512f(auVar78,auVar80,0xd8);
                      auVar80 = vshufi64x2_avx512f(auVar82,auVar85,0xd8);
                      auVar77 = vshufi64x2_avx512f(auVar79,auVar77,0xd8);
                      if (iVar50 == 0x10) {
                        auVar79 = vmovdqa64_avx512f(auVar83);
                        *pauVar32 = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar94);
                        pauVar32[1] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar95);
                        pauVar32[2] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar96);
                        pauVar32[3] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar97);
                        pauVar32[4] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar98);
                        pauVar32[5] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar99);
                        pauVar32[6] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar100);
                        pauVar32[7] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar81);
                        pauVar32[8] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar84);
                        pauVar32[9] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar86);
                        pauVar32[10] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar87);
                        pauVar32[0xb] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar88);
                        pauVar32[0xc] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar78);
                        pauVar32[0xd] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar80);
                        pauVar32[0xe] = auVar79;
                        auVar79 = vmovdqa64_avx512f(auVar77);
                        pauVar32[0xf] = auVar79;
                        pauVar32 = pauVar32 + 0x10;
                      }
                      if (iVar50 == 8) {
                        auVar79 = vinserti64x4_avx512f(auVar83,auVar94._0_32_,1);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        *pauVar32 = auVar79;
                        auVar79 = vinserti64x4_avx512f(auVar95,auVar96._0_32_,1);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        pauVar32[1] = auVar79;
                        auVar79 = vinserti64x4_avx512f(auVar97,auVar98._0_32_,1);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        pauVar32[2] = auVar79;
                        auVar79 = vinserti64x4_avx512f(auVar99,auVar100._0_32_,1);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        pauVar32[3] = auVar79;
                        auVar79 = vinserti64x4_avx512f(auVar81,auVar84._0_32_,1);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        pauVar32[4] = auVar79;
                        auVar79 = vinserti64x4_avx512f(auVar86,auVar87._0_32_,1);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        pauVar32[5] = auVar79;
                        auVar79 = vinserti64x4_avx512f(auVar88,auVar78._0_32_,1);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        pauVar32[6] = auVar79;
                        auVar79 = vinserti64x4_avx512f(auVar80,auVar77._0_32_,1);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        pauVar32[7] = auVar79;
                        auVar79 = vshufi64x2_avx512f(auVar83,auVar94,0xee);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(*pauVar32 + lVar46 * 4) = auVar79;
                        auVar79 = vshufi64x2_avx512f(auVar95,auVar96,0xee);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(pauVar32[1] + lVar46 * 4) = auVar79;
                        auVar79 = vshufi64x2_avx512f(auVar97,auVar98,0xee);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(pauVar32[2] + lVar46 * 4) = auVar79;
                        auVar79 = vshufi64x2_avx512f(auVar99,auVar100,0xee);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(pauVar32[3] + lVar46 * 4) = auVar79;
                        auVar79 = vshufi64x2_avx512f(auVar81,auVar84,0xee);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(pauVar32[4] + lVar46 * 4) = auVar79;
                        auVar79 = vshufi64x2_avx512f(auVar86,auVar87,0xee);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(pauVar32[5] + lVar46 * 4) = auVar79;
                        auVar79 = vshufi64x2_avx512f(auVar88,auVar78,0xee);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(pauVar32[6] + lVar46 * 4) = auVar79;
                        auVar79 = vshufi64x2_avx512f(auVar80,auVar77,0xee);
                        auVar79 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(pauVar32[7] + lVar46 * 4) = auVar79;
                        pauVar32 = pauVar32 + 8;
                      }
                      if (iVar50 == 4) {
                        auVar75 = vshufi64x2_avx512f(auVar83,auVar94,0x88);
                        auVar79 = vshufi64x2_avx512f(auVar95,auVar96,0x88);
                        auVar82 = vshufi64x2_avx512f(auVar97,auVar98,0x88);
                        auVar85 = vshufi64x2_avx512f(auVar99,auVar100,0x88);
                        auVar89 = vshufi64x2_avx512f(auVar81,auVar84,0x88);
                        auVar90 = vshufi64x2_avx512f(auVar86,auVar87,0x88);
                        auVar91 = vshufi64x2_avx512f(auVar88,auVar78,0x88);
                        auVar92 = vshufi64x2_avx512f(auVar80,auVar77,0x88);
                        auVar93 = vshufi64x2_avx512f(auVar83,auVar94,0xdd);
                        auVar101 = vshufi64x2_avx512f(auVar95,auVar96,0xdd);
                        auVar102 = vshufi64x2_avx512f(auVar97,auVar98,0xdd);
                        auVar103 = vshufi64x2_avx512f(auVar99,auVar100,0xdd);
                        auVar104 = vshufi64x2_avx512f(auVar81,auVar84,0xdd);
                        auVar105 = vshufi64x2_avx512f(auVar86,auVar87,0xdd);
                        auVar106 = vshufi64x2_avx512f(auVar88,auVar78,0xdd);
                        auVar77 = vshufi64x2_avx512f(auVar80,auVar77,0xdd);
                        auVar83 = vshufi64x2_avx512f(auVar75,auVar79,0x88);
                        auVar94 = vshufi64x2_avx512f(auVar82,auVar85,0x88);
                        auVar95 = vshufi64x2_avx512f(auVar89,auVar90,0x88);
                        auVar96 = vshufi64x2_avx512f(auVar91,auVar92,0x88);
                        auVar97 = vshufi64x2_avx512f(auVar93,auVar101,0x88);
                        auVar98 = vshufi64x2_avx512f(auVar102,auVar103,0x88);
                        auVar99 = vshufi64x2_avx512f(auVar104,auVar105,0x88);
                        auVar100 = vshufi64x2_avx512f(auVar106,auVar77,0x88);
                        auVar81 = vshufi64x2_avx512f(auVar75,auVar79,0xdd);
                        auVar84 = vshufi64x2_avx512f(auVar82,auVar85,0xdd);
                        auVar86 = vshufi64x2_avx512f(auVar89,auVar90,0xdd);
                        auVar87 = vshufi64x2_avx512f(auVar91,auVar92,0xdd);
                        auVar88 = vshufi64x2_avx512f(auVar93,auVar101,0xdd);
                        auVar78 = vshufi64x2_avx512f(auVar102,auVar103,0xdd);
                        auVar75 = vpmovsxbd_avx512f(_DAT_005f2b50);
                        auVar80 = vshufi64x2_avx512f(auVar104,auVar105,0xdd);
                        auVar77 = vshufi64x2_avx512f(auVar106,auVar77,0xdd);
                        auVar79 = vmovdqu64_avx512f(auVar83);
                        *pauVar32 = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar94);
                        pauVar32[1] = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar95);
                        pauVar32[2] = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar96);
                        pauVar32[3] = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar97);
                        *(undefined1 (*) [64])(*pauVar32 + lVar48 * 4) = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar98);
                        *(undefined1 (*) [64])(pauVar32[1] + lVar48 * 4) = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar99);
                        *(undefined1 (*) [64])(pauVar32[2] + lVar48 * 4) = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar100);
                        *(undefined1 (*) [64])(pauVar32[3] + lVar48 * 4) = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar81);
                        *(undefined1 (*) [64])(*pauVar32 + lVar46 * 4) = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar84);
                        *(undefined1 (*) [64])(pauVar32[1] + lVar46 * 4) = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar86);
                        *(undefined1 (*) [64])(pauVar32[2] + lVar46 * 4) = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar87);
                        *(undefined1 (*) [64])(pauVar32[3] + lVar46 * 4) = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar88);
                        *(undefined1 (*) [64])(*pauVar32 + lVar49 * 4) = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar78);
                        *(undefined1 (*) [64])(pauVar32[1] + lVar49 * 4) = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(pauVar32[2] + lVar49 * 4) = auVar79;
                        auVar79 = vmovdqu64_avx512f(auVar77);
                        *(undefined1 (*) [64])(pauVar32[3] + lVar49 * 4) = auVar79;
                        pauVar32 = pauVar32 + 4;
                      }
                      if (iVar50 == 1) {
                        auVar79 = vpunpckldq_avx512f(auVar83,auVar94);
                        auVar82 = vpunpckhdq_avx512f(auVar83,auVar94);
                        auVar83 = vpunpckldq_avx512f(auVar95,auVar96);
                        auVar85 = vpunpckhdq_avx512f(auVar95,auVar96);
                        auVar89 = vpunpckldq_avx512f(auVar97,auVar98);
                        auVar90 = vpunpckhdq_avx512f(auVar97,auVar98);
                        auVar91 = vpunpckldq_avx512f(auVar99,auVar100);
                        auVar92 = vpunpckhdq_avx512f(auVar99,auVar100);
                        auVar93 = vpunpckldq_avx512f(auVar81,auVar84);
                        auVar81 = vpunpckhdq_avx512f(auVar81,auVar84);
                        auVar84 = vpunpckldq_avx512f(auVar86,auVar87);
                        auVar86 = vpunpckhdq_avx512f(auVar86,auVar87);
                        auVar87 = vpunpckldq_avx512f(auVar88,auVar78);
                        auVar78 = vpunpckhdq_avx512f(auVar88,auVar78);
                        auVar88 = vpunpckldq_avx512f(auVar80,auVar77);
                        auVar77 = vpunpckhdq_avx512f(auVar80,auVar77);
                        auVar80 = vpunpckhqdq_avx512f(auVar79,auVar83);
                        auVar94 = vpunpckhqdq_avx512f(auVar82,auVar85);
                        auVar95 = vpunpckhqdq_avx512f(auVar89,auVar91);
                        auVar96 = vpunpckhqdq_avx512f(auVar90,auVar92);
                        auVar97 = vpunpckhqdq_avx512f(auVar93,auVar84);
                        auVar98 = vpunpckhqdq_avx512f(auVar81,auVar86);
                        auVar99 = vpunpckhqdq_avx512f(auVar87,auVar88);
                        auVar100 = vpunpckhqdq_avx512f(auVar78,auVar77);
                        auVar79 = vpunpcklqdq_avx512f(auVar79,auVar83);
                        auVar83 = vpunpcklqdq_avx512f(auVar89,auVar91);
                        auVar89 = vshufi64x2_avx512f(auVar79,auVar83,0x88);
                        auVar84 = vpunpcklqdq_avx512f(auVar93,auVar84);
                        auVar87 = vpunpcklqdq_avx512f(auVar87,auVar88);
                        auVar88 = vshufi64x2_avx512f(auVar84,auVar87,0x88);
                        auVar91 = vshufi64x2_avx512f(auVar80,auVar95,0x88);
                        auVar93 = vshufi64x2_avx512f(auVar97,auVar99,0x88);
                        auVar82 = vpunpcklqdq_avx512f(auVar82,auVar85);
                        auVar85 = vpunpcklqdq_avx512f(auVar90,auVar92);
                        auVar90 = vshufi64x2_avx512f(auVar82,auVar85,0x88);
                        auVar81 = vpunpcklqdq_avx512f(auVar81,auVar86);
                        auVar77 = vpunpcklqdq_avx512f(auVar78,auVar77);
                        auVar78 = vshufi64x2_avx512f(auVar81,auVar77,0x88);
                        auVar86 = vshufi64x2_avx512f(auVar94,auVar96,0x88);
                        auVar92 = vshufi64x2_avx512f(auVar98,auVar100,0x88);
                        auVar79 = vshufi64x2_avx512f(auVar79,auVar83,0xdd);
                        auVar83 = vshufi64x2_avx512f(auVar84,auVar87,0xdd);
                        auVar80 = vshufi64x2_avx512f(auVar80,auVar95,0xdd);
                        auVar84 = vshufi64x2_avx512f(auVar97,auVar99,0xdd);
                        auVar82 = vshufi64x2_avx512f(auVar82,auVar85,0xdd);
                        auVar77 = vshufi64x2_avx512f(auVar81,auVar77,0xdd);
                        auVar81 = vshufi64x2_avx512f(auVar94,auVar96,0xdd);
                        auVar85 = vshufi64x2_avx512f(auVar98,auVar100,0xdd);
                        auVar87 = vshufi64x2_avx512f(auVar89,auVar88,0x88);
                        auVar94 = vshufi64x2_avx512f(auVar91,auVar93,0x88);
                        auVar95 = vshufi64x2_avx512f(auVar90,auVar78,0x88);
                        auVar96 = vshufi64x2_avx512f(auVar86,auVar92,0x88);
                        auVar97 = vshufi64x2_avx512f(auVar79,auVar83,0x88);
                        auVar98 = vshufi64x2_avx512f(auVar80,auVar84,0x88);
                        auVar99 = vshufi64x2_avx512f(auVar82,auVar77,0x88);
                        auVar100 = vshufi64x2_avx512f(auVar81,auVar85,0x88);
                        auVar88 = vshufi64x2_avx512f(auVar89,auVar88,0xdd);
                        auVar89 = vshufi64x2_avx512f(auVar91,auVar93,0xdd);
                        auVar78 = vshufi64x2_avx512f(auVar90,auVar78,0xdd);
                        auVar86 = vshufi64x2_avx512f(auVar86,auVar92,0xdd);
                        auVar79 = vshufi64x2_avx512f(auVar79,auVar83,0xdd);
                        auVar80 = vshufi64x2_avx512f(auVar80,auVar84,0xdd);
                        auVar82 = vshufi64x2_avx512f(auVar82,auVar77,0xdd);
                        auVar81 = vshufi64x2_avx512f(auVar81,auVar85,0xdd);
                        auVar77 = vmovdqu64_avx512f(auVar87);
                        *pauVar32 = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar94);
                        *(undefined1 (*) [64])(*pauVar32 + lVar60 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar95);
                        *(undefined1 (*) [64])(*pauVar32 + lVar18 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar96);
                        *(undefined1 (*) [64])(*pauVar32 + lVar39 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar97);
                        *(undefined1 (*) [64])(*pauVar32 + lVar48 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar98);
                        *(undefined1 (*) [64])(*pauVar32 + lVar40 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar99);
                        *(undefined1 (*) [64])(*pauVar32 + lVar41 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar100);
                        *(undefined1 (*) [64])(*pauVar32 + lVar42 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar88);
                        *(undefined1 (*) [64])(*pauVar32 + lVar46 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar89);
                        *(undefined1 (*) [64])(*pauVar32 + lVar19 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar78);
                        *(undefined1 (*) [64])(*pauVar32 + lVar20 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar86);
                        *(undefined1 (*) [64])(*pauVar32 + lVar61 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(*pauVar32 + lVar49 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(*pauVar32 + lVar58 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar82);
                        *(undefined1 (*) [64])(*pauVar32 + lVar52 * 4) = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar81);
                        *(undefined1 (*) [64])(*pauVar32 + lVar53 * 4) = auVar77;
                        pauVar32 = pauVar32 + 1;
                      }
                      iVar47 = iVar47 + 0x10;
                      pauVar17 = pauVar28 + 0x10;
                    } while (iVar47 < (int)uVar55);
                    pauVar17 = pauVar28 + 0x10;
                    uVar35 = uVar55 & 0xfffffff0;
                  }
                  uVar30 = uVar35;
                  if ((int)(uVar35 | 7) < (int)uVar55) {
                    do {
                      pauVar28 = pauVar17;
                      auVar77 = vmovdqa64_avx512f(*pauVar28);
                      auVar78 = vmovdqa64_avx512f(pauVar28[2]);
                      auVar79 = vmovdqa64_avx512f(pauVar28[4]);
                      auVar80 = vpshufd_avx512f(pauVar28[1],0x93);
                      auVar81 = vpshufd_avx512f(pauVar28[3],0x93);
                      auVar82 = vpshufd_avx512f(pauVar28[5],0x93);
                      auVar83 = vmovdqa64_avx512f(pauVar28[6]);
                      auVar84 = vpshufd_avx512f(pauVar28[7],0x93);
                      auVar85 = vpunpckldq_avx512f(auVar77,auVar81);
                      auVar77 = vpunpckhdq_avx512f(auVar77,auVar81);
                      auVar81 = vpunpckldq_avx512f(auVar78,auVar80);
                      auVar78 = vpunpckhdq_avx512f(auVar78,auVar80);
                      auVar80 = vpunpckldq_avx512f(auVar79,auVar84);
                      auVar79 = vpunpckhdq_avx512f(auVar79,auVar84);
                      auVar84 = vpunpckldq_avx512f(auVar83,auVar82);
                      auVar82 = vpunpckhdq_avx512f(auVar83,auVar82);
                      auVar83 = vpunpcklqdq_avx512f(auVar85,auVar81);
                      auVar86 = vpunpcklqdq_avx512f(auVar78,auVar77);
                      auVar87 = vpunpcklqdq_avx512f(auVar80,auVar84);
                      auVar88 = vpunpcklqdq_avx512f(auVar82,auVar79);
                      auVar81 = vpermt2d_avx512f(auVar81,auVar75,auVar85);
                      auVar77 = vpermt2d_avx512f(auVar77,auVar75,auVar78);
                      auVar78 = vpermt2d_avx512f(auVar84,auVar75,auVar80);
                      auVar79 = vpermt2d_avx512f(auVar79,auVar75,auVar82);
                      auVar80 = vshufi64x2_avx512f(auVar83,auVar87,0x14);
                      auVar82 = vshufi64x2_avx512f(auVar81,auVar78,0x14);
                      auVar84 = vshufi64x2_avx512f(auVar86,auVar88,0x14);
                      auVar85 = vshufi64x2_avx512f(auVar77,auVar79,0x14);
                      auVar83 = vshufi64x2_avx512f(auVar83,auVar87,0xbe);
                      auVar78 = vshufi64x2_avx512f(auVar81,auVar78,0xbe);
                      auVar81 = vshufi64x2_avx512f(auVar86,auVar88,0xbe);
                      auVar77 = vshufi64x2_avx512f(auVar77,auVar79,0xbe);
                      auVar79 = vshufi64x2_avx512f(auVar80,auVar83,0x88);
                      auVar86 = vshufi64x2_avx512f(auVar82,auVar78,0x88);
                      auVar87 = vshufi64x2_avx512f(auVar84,auVar81,0x88);
                      auVar88 = vshufi64x2_avx512f(auVar85,auVar77,0x88);
                      auVar80 = vshufi64x2_avx512f(auVar80,auVar83,0x77);
                      auVar78 = vshufi64x2_avx512f(auVar82,auVar78,0x77);
                      auVar81 = vshufi64x2_avx512f(auVar84,auVar81,0x77);
                      auVar77 = vshufi64x2_avx512f(auVar85,auVar77,0x77);
                      if (iVar50 == 0x10) {
                        auVar82 = vmovdqa64_avx512f(auVar79);
                        *pauVar32 = auVar82;
                        auVar82 = vmovdqa64_avx512f(auVar86);
                        pauVar32[1] = auVar82;
                        auVar82 = vmovdqa64_avx512f(auVar87);
                        pauVar32[2] = auVar82;
                        auVar82 = vmovdqa64_avx512f(auVar88);
                        pauVar32[3] = auVar82;
                        auVar82 = vmovdqa64_avx512f(auVar80);
                        pauVar32[4] = auVar82;
                        auVar82 = vmovdqa64_avx512f(auVar78);
                        pauVar32[5] = auVar82;
                        auVar82 = vmovdqa64_avx512f(auVar81);
                        pauVar32[6] = auVar82;
                        auVar82 = vmovdqa64_avx512f(auVar77);
                        pauVar32[7] = auVar82;
                        pauVar32 = pauVar32 + 8;
                      }
                      if (iVar50 == 8) {
                        auVar82 = vinserti64x4_avx512f(auVar79,auVar86._0_32_,1);
                        auVar82 = vmovdqu64_avx512f(auVar82);
                        *pauVar32 = auVar82;
                        auVar82 = vinserti64x4_avx512f(auVar87,auVar88._0_32_,1);
                        auVar82 = vmovdqu64_avx512f(auVar82);
                        pauVar32[1] = auVar82;
                        auVar82 = vinserti64x4_avx512f(auVar80,auVar78._0_32_,1);
                        auVar82 = vmovdqu64_avx512f(auVar82);
                        pauVar32[2] = auVar82;
                        auVar82 = vinserti64x4_avx512f(auVar81,auVar77._0_32_,1);
                        auVar82 = vmovdqu64_avx512f(auVar82);
                        pauVar32[3] = auVar82;
                        auVar82 = vshufi64x2_avx512f(auVar79,auVar86,0xee);
                        auVar82 = vmovdqu64_avx512f(auVar82);
                        *(undefined1 (*) [64])(*pauVar32 + lVar46 * 4) = auVar82;
                        auVar82 = vshufi64x2_avx512f(auVar87,auVar88,0xee);
                        auVar82 = vmovdqu64_avx512f(auVar82);
                        *(undefined1 (*) [64])(pauVar32[1] + lVar46 * 4) = auVar82;
                        auVar82 = vshufi64x2_avx512f(auVar80,auVar78,0xee);
                        auVar82 = vmovdqu64_avx512f(auVar82);
                        *(undefined1 (*) [64])(pauVar32[2] + lVar46 * 4) = auVar82;
                        auVar82 = vshufi64x2_avx512f(auVar81,auVar77,0xee);
                        auVar82 = vmovdqu64_avx512f(auVar82);
                        *(undefined1 (*) [64])(pauVar32[3] + lVar46 * 4) = auVar82;
                        pauVar32 = pauVar32 + 4;
                      }
                      if (iVar50 == 4) {
                        auVar82 = vshufi64x2_avx512f(auVar79,auVar86,0x88);
                        auVar83 = vshufi64x2_avx512f(auVar87,auVar88,0x88);
                        auVar84 = vshufi64x2_avx512f(auVar80,auVar78,0x88);
                        auVar85 = vshufi64x2_avx512f(auVar81,auVar77,0x88);
                        auVar89 = vshufi64x2_avx512f(auVar79,auVar86,0xdd);
                        auVar90 = vshufi64x2_avx512f(auVar87,auVar88,0xdd);
                        auVar91 = vshufi64x2_avx512f(auVar80,auVar78,0xdd);
                        auVar77 = vshufi64x2_avx512f(auVar81,auVar77,0xdd);
                        auVar79 = vshufi64x2_avx512f(auVar82,auVar83,0x88);
                        auVar86 = vshufi64x2_avx512f(auVar84,auVar85,0x88);
                        auVar87 = vshufi64x2_avx512f(auVar89,auVar90,0x88);
                        auVar88 = vshufi64x2_avx512f(auVar91,auVar77,0x88);
                        auVar80 = vshufi64x2_avx512f(auVar82,auVar83,0xdd);
                        auVar78 = vshufi64x2_avx512f(auVar84,auVar85,0xdd);
                        auVar81 = vshufi64x2_avx512f(auVar89,auVar90,0xdd);
                        auVar77 = vshufi64x2_avx512f(auVar91,auVar77,0xdd);
                        auVar82 = vmovdqu64_avx512f(auVar79);
                        *pauVar32 = auVar82;
                        auVar82 = vmovdqu64_avx512f(auVar86);
                        pauVar32[1] = auVar82;
                        auVar82 = vmovdqu64_avx512f(auVar87);
                        *(undefined1 (*) [64])(*pauVar32 + lVar48 * 4) = auVar82;
                        auVar82 = vmovdqu64_avx512f(auVar88);
                        *(undefined1 (*) [64])(pauVar32[1] + lVar48 * 4) = auVar82;
                        auVar82 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(*pauVar32 + lVar46 * 4) = auVar82;
                        auVar82 = vmovdqu64_avx512f(auVar78);
                        *(undefined1 (*) [64])(pauVar32[1] + lVar46 * 4) = auVar82;
                        auVar82 = vmovdqu64_avx512f(auVar81);
                        *(undefined1 (*) [64])(*pauVar32 + lVar49 * 4) = auVar82;
                        auVar82 = vmovdqu64_avx512f(auVar77);
                        *(undefined1 (*) [64])(pauVar32[1] + lVar49 * 4) = auVar82;
                        pauVar32 = pauVar32 + 2;
                      }
                      if (iVar50 == 1) {
                        auVar82 = vpunpckldq_avx512f(auVar79,auVar86);
                        auVar79 = vpunpckhdq_avx512f(auVar79,auVar86);
                        auVar83 = vpunpckldq_avx512f(auVar87,auVar88);
                        auVar84 = vpunpckhdq_avx512f(auVar87,auVar88);
                        auVar85 = vpunpckldq_avx512f(auVar80,auVar78);
                        auVar78 = vpunpckhdq_avx512f(auVar80,auVar78);
                        auVar80 = vpunpckldq_avx512f(auVar81,auVar77);
                        auVar77 = vpunpckhdq_avx512f(auVar81,auVar77);
                        auVar81 = vpunpckhqdq_avx512f(auVar82,auVar83);
                        auVar86 = vpunpckhqdq_avx512f(auVar79,auVar84);
                        auVar87 = vpunpckhqdq_avx512f(auVar85,auVar80);
                        auVar88 = vpunpckhqdq_avx512f(auVar78,auVar77);
                        auVar82 = vpunpcklqdq_avx512f(auVar82,auVar83);
                        auVar80 = vpunpcklqdq_avx512f(auVar85,auVar80);
                        auVar83 = vshufi64x2_avx512f(auVar82,auVar80,0x88);
                        auVar85 = vshufi64x2_avx512f(auVar81,auVar87,0x88);
                        auVar79 = vpunpcklqdq_avx512f(auVar79,auVar84);
                        auVar77 = vpunpcklqdq_avx512f(auVar78,auVar77);
                        auVar78 = vshufi64x2_avx512f(auVar79,auVar77,0x88);
                        auVar84 = vshufi64x2_avx512f(auVar86,auVar88,0x88);
                        auVar80 = vshufi64x2_avx512f(auVar82,auVar80,0xdd);
                        auVar81 = vshufi64x2_avx512f(auVar81,auVar87,0xdd);
                        auVar77 = vshufi64x2_avx512f(auVar79,auVar77,0xdd);
                        auVar79 = vshufi64x2_avx512f(auVar86,auVar88,0xdd);
                        auVar82 = vshufi64x2_avx512f(auVar83,auVar85,0x88);
                        auVar86 = vshufi64x2_avx512f(auVar78,auVar84,0x88);
                        auVar87 = vshufi64x2_avx512f(auVar80,auVar81,0x88);
                        auVar88 = vshufi64x2_avx512f(auVar77,auVar79,0x88);
                        auVar83 = vshufi64x2_avx512f(auVar83,auVar85,0xdd);
                        auVar78 = vshufi64x2_avx512f(auVar78,auVar84,0xdd);
                        auVar80 = vshufi64x2_avx512f(auVar80,auVar81,0xdd);
                        auVar77 = vshufi64x2_avx512f(auVar77,auVar79,0xdd);
                        *(undefined1 (*) [32])*pauVar32 = auVar82._0_32_;
                        auVar69 = vextracti64x4_avx512f(auVar82,1);
                        *(undefined1 (*) [32])(*pauVar32 + lVar60 * 4) = auVar69;
                        *(undefined1 (*) [32])(*pauVar32 + lVar18 * 4) = auVar86._0_32_;
                        auVar69 = vextracti64x4_avx512f(auVar86,1);
                        *(undefined1 (*) [32])(*pauVar32 + lVar39 * 4) = auVar69;
                        *(undefined1 (*) [32])(*pauVar32 + lVar48 * 4) = auVar87._0_32_;
                        auVar69 = vextracti64x4_avx512f(auVar87,1);
                        *(undefined1 (*) [32])(*pauVar32 + lVar40 * 4) = auVar69;
                        *(undefined1 (*) [32])(*pauVar32 + lVar41 * 4) = auVar88._0_32_;
                        auVar69 = vextracti64x4_avx512f(auVar88,1);
                        *(undefined1 (*) [32])(*pauVar32 + lVar42 * 4) = auVar69;
                        *(undefined1 (*) [32])(*pauVar32 + lVar46 * 4) = auVar83._0_32_;
                        auVar69 = vextracti64x4_avx512f(auVar83,1);
                        *(undefined1 (*) [32])(*pauVar32 + lVar19 * 4) = auVar69;
                        *(undefined1 (*) [32])(*pauVar32 + lVar20 * 4) = auVar78._0_32_;
                        auVar69 = vextracti64x4_avx512f(auVar78,1);
                        *(undefined1 (*) [32])(*pauVar32 + lVar61 * 4) = auVar69;
                        *(undefined1 (*) [32])(*pauVar32 + lVar49 * 4) = auVar80._0_32_;
                        auVar69 = vextracti64x4_avx512f(auVar80,1);
                        *(undefined1 (*) [32])(*pauVar32 + lVar58 * 4) = auVar69;
                        *(undefined1 (*) [32])(*pauVar32 + lVar52 * 4) = auVar77._0_32_;
                        auVar69 = vextracti64x4_avx512f(auVar77,1);
                        *(undefined1 (*) [32])(*pauVar32 + lVar53 * 4) = auVar69;
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x20);
                      }
                      uVar35 = uVar30 + 8;
                      iVar47 = uVar30 + 0xf;
                      pauVar17 = pauVar28 + 8;
                      uVar30 = uVar35;
                    } while (iVar47 < (int)uVar55);
                    pauVar17 = pauVar28 + 8;
                  }
                  uVar30 = uVar35;
                  if ((int)(uVar35 | 3) < (int)uVar55) {
                    do {
                      pauVar28 = pauVar17;
                      auVar77 = vmovdqa64_avx512f(*pauVar28);
                      auVar78 = vpshufd_avx512f(pauVar28[1],0x93);
                      auVar79 = vmovdqa64_avx512f(pauVar28[2]);
                      auVar80 = vpshufd_avx512f(pauVar28[3],0x93);
                      auVar81 = vpunpckldq_avx512f(auVar77,auVar80);
                      auVar77 = vpunpckhdq_avx512f(auVar77,auVar80);
                      auVar80 = vpunpckldq_avx512f(auVar79,auVar78);
                      auVar78 = vpunpckhdq_avx512f(auVar79,auVar78);
                      auVar79 = vpunpcklqdq_avx512f(auVar81,auVar80);
                      auVar82 = vpunpcklqdq_avx512f(auVar78,auVar77);
                      auVar80 = vpermt2d_avx512f(auVar80,auVar75,auVar81);
                      auVar77 = vpermt2d_avx512f(auVar77,auVar75,auVar78);
                      if (iVar50 == 0x10) {
                        auVar78 = vmovdqa64_avx512f(auVar79);
                        *pauVar32 = auVar78;
                        auVar78 = vmovdqa64_avx512f(auVar80);
                        pauVar32[1] = auVar78;
                        auVar78 = vmovdqa64_avx512f(auVar82);
                        pauVar32[2] = auVar78;
                        auVar78 = vmovdqa64_avx512f(auVar77);
                        pauVar32[3] = auVar78;
                        pauVar32 = pauVar32 + 4;
                      }
                      auVar78 = vshufi64x2_avx512f(auVar79,auVar80,0xee);
                      auVar81 = vshufi64x2_avx512f(auVar82,auVar77,0xee);
                      if (iVar50 == 8) {
                        auVar83 = vinserti64x4_avx512f(auVar79,auVar80._0_32_,1);
                        auVar84 = vinserti64x4_avx512f(auVar82,auVar77._0_32_,1);
                        auVar83 = vmovdqu64_avx512f(auVar83);
                        *pauVar32 = auVar83;
                        auVar83 = vmovdqu64_avx512f(auVar84);
                        pauVar32[1] = auVar83;
                        auVar83 = vmovdqu64_avx512f(auVar78);
                        *(undefined1 (*) [64])(*pauVar32 + lVar46 * 4) = auVar83;
                        auVar83 = vmovdqu64_avx512f(auVar81);
                        *(undefined1 (*) [64])(pauVar32[1] + lVar46 * 4) = auVar83;
                        pauVar32 = pauVar32 + 2;
                      }
                      if (iVar50 == 4) {
                        auVar80 = vinserti64x4_avx512f(auVar79,auVar80._0_32_,1);
                        auVar77 = vinserti64x4_avx512f(auVar82,auVar77._0_32_,1);
                        auVar79 = vshufi64x2_avx512f(auVar80,auVar77,0x88);
                        auVar80 = vshufi64x2_avx512f(auVar80,auVar77,0xdd);
                        auVar82 = vshufi64x2_avx512f(auVar78,auVar81,0x88);
                        auVar77 = vshufi64x2_avx512f(auVar78,auVar81,0xdd);
                        auVar78 = vmovdqu64_avx512f(auVar79);
                        *pauVar32 = auVar78;
                        auVar78 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(*pauVar32 + lVar48 * 4) = auVar78;
                        auVar78 = vmovdqu64_avx512f(auVar82);
                        *(undefined1 (*) [64])(*pauVar32 + lVar46 * 4) = auVar78;
                        auVar78 = vmovdqu64_avx512f(auVar77);
                        *(undefined1 (*) [64])(*pauVar32 + lVar49 * 4) = auVar78;
                        pauVar32 = pauVar32 + 1;
                      }
                      if (iVar50 == 1) {
                        auVar78 = vpunpckldq_avx512f(auVar79,auVar80);
                        auVar79 = vpunpckhdq_avx512f(auVar79,auVar80);
                        auVar80 = vpunpckldq_avx512f(auVar82,auVar77);
                        auVar77 = vpunpckhdq_avx512f(auVar82,auVar77);
                        auVar81 = vpunpckhqdq_avx512f(auVar78,auVar80);
                        auVar82 = vpunpckhqdq_avx512f(auVar79,auVar77);
                        auVar78 = vpunpcklqdq_avx512f(auVar78,auVar80);
                        auVar77 = vpunpcklqdq_avx512f(auVar79,auVar77);
                        *(undefined1 (*) [16])*pauVar32 = auVar78._0_16_;
                        *(undefined1 (*) [16])(*pauVar32 + lVar60 * 4) = auVar81._0_16_;
                        *(undefined1 (*) [16])(*pauVar32 + lVar18 * 4) = auVar77._0_16_;
                        *(undefined1 (*) [16])(*pauVar32 + lVar39 * 4) = auVar82._0_16_;
                        auVar66 = vextracti32x4_avx512f(auVar78,1);
                        *(undefined1 (*) [16])(*pauVar32 + lVar48 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar81,1);
                        *(undefined1 (*) [16])(*pauVar32 + lVar40 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar77,1);
                        *(undefined1 (*) [16])(*pauVar32 + lVar41 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar82,1);
                        *(undefined1 (*) [16])(*pauVar32 + lVar42 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar78,2);
                        *(undefined1 (*) [16])(*pauVar32 + lVar46 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar81,2);
                        *(undefined1 (*) [16])(*pauVar32 + lVar19 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar77,2);
                        *(undefined1 (*) [16])(*pauVar32 + lVar20 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar82,2);
                        *(undefined1 (*) [16])(*pauVar32 + lVar61 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar78,3);
                        *(undefined1 (*) [16])(*pauVar32 + lVar49 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar81,3);
                        *(undefined1 (*) [16])(*pauVar32 + lVar58 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar77,3);
                        *(undefined1 (*) [16])(*pauVar32 + lVar52 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar82,3);
                        *(undefined1 (*) [16])(*pauVar32 + lVar53 * 4) = auVar66;
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x10);
                      }
                      uVar35 = uVar30 + 4;
                      iVar47 = uVar30 + 7;
                      pauVar17 = pauVar28 + 4;
                      uVar30 = uVar35;
                    } while (iVar47 < (int)uVar55);
                    pauVar17 = pauVar28 + 4;
                  }
                  uVar30 = uVar35;
                  if ((int)(uVar35 | 1) < (int)uVar55) {
                    do {
                      pauVar28 = pauVar17;
                      auVar77 = vpshufd_avx512f(*pauVar28,0xd8);
                      auVar78 = vpshufd_avx512f(pauVar28[1],0x2d);
                      auVar79 = vpunpckldq_avx512f(auVar77,auVar78);
                      auVar80 = vpmovsxbd_avx512f(_DAT_005f2b60);
                      auVar77 = vpermt2d_avx512f(auVar78,auVar80,auVar77);
                      if (iVar50 == 0x10) {
                        auVar78 = vmovdqa64_avx512f(auVar79);
                        *pauVar32 = auVar78;
                        auVar78 = vmovdqa64_avx512f(auVar77);
                        pauVar32[1] = auVar78;
                        pauVar32 = pauVar32 + 2;
                      }
                      if (iVar50 == 8) {
                        auVar78 = vinserti64x4_avx512f(auVar79,auVar77._0_32_,1);
                        auVar80 = vshufi64x2_avx512f(auVar79,auVar77,0xee);
                        auVar78 = vmovdqu64_avx512f(auVar78);
                        *pauVar32 = auVar78;
                        auVar78 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(*pauVar32 + lVar46 * 4) = auVar78;
                        pauVar32 = pauVar32 + 1;
                      }
                      if (iVar50 == 4) {
                        *(undefined1 (*) [16])(*pauVar32 + 0x10) = auVar77._0_16_;
                        *(undefined1 (*) [16])*pauVar32 = auVar79._0_16_;
                        auVar66 = vextracti32x4_avx512f(auVar77,1);
                        *(undefined1 (*) [16])(*pauVar32 + lVar48 * 4 + 8) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar79,1);
                        *(undefined1 (*) [16])(*pauVar32 + lVar48 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar77,2);
                        *(undefined1 (*) [16])(*pauVar32 + lVar46 * 4 + 8) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar79,2);
                        *(undefined1 (*) [16])(*pauVar32 + lVar46 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar77,3);
                        *(undefined1 (*) [16])(*pauVar32 + lVar49 * 4 + 8) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar79,3);
                        *(undefined1 (*) [16])(*pauVar32 + lVar49 * 4) = auVar66;
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x20);
                      }
                      if (iVar50 == 1) {
                        vpscatterdd_avx512f(ZEXT864(pauVar32) + ZEXT864(0) +
                                            auVar76 * (undefined1  [64])0x4,0xffff,auVar79);
                        vpscatterdd_avx512f(ZEXT864(pauVar32) + ZEXT864(4) +
                                            auVar76 * (undefined1  [64])0x4,0xffff,auVar77);
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 8);
                      }
                      uVar35 = uVar30 + 2;
                      iVar47 = uVar30 + 3;
                      pauVar17 = pauVar28 + 2;
                      uVar30 = uVar35;
                    } while (iVar47 < (int)uVar55);
                    pauVar17 = pauVar28 + 2;
                  }
                  iVar47 = uVar55 - uVar35;
                  if (iVar47 != 0 && (int)uVar35 <= (int)uVar55) {
                    do {
                      auVar77 = vmovdqa64_avx512f(*pauVar17);
                      if (iVar50 == 0x10) {
                        auVar78 = vmovdqa64_avx512f(auVar77);
                        *pauVar32 = auVar78;
                        pauVar32 = pauVar32 + 1;
                      }
                      if (iVar50 == 8) {
                        *(undefined1 (*) [32])*pauVar32 = auVar77._0_32_;
                        auVar69 = vextracti64x4_avx512f(auVar77,1);
                        *(undefined1 (*) [32])(*pauVar32 + lVar46 * 4) = auVar69;
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x20);
                      }
                      if (iVar50 == 4) {
                        *(undefined1 (*) [16])*pauVar32 = auVar77._0_16_;
                        auVar66 = vextracti32x4_avx512f(auVar77,1);
                        *(undefined1 (*) [16])(*pauVar32 + lVar48 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar77,2);
                        *(undefined1 (*) [16])(*pauVar32 + lVar46 * 4) = auVar66;
                        auVar66 = vextracti32x4_avx512f(auVar77,3);
                        *(undefined1 (*) [16])(*pauVar32 + lVar49 * 4) = auVar66;
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x10);
                      }
                      if (iVar50 == 1) {
                        vpscatterdd_avx512f(ZEXT864(pauVar32) + ZEXT864(0) +
                                            auVar76 * (undefined1  [64])0x4,0xffff,auVar77);
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 4);
                      }
                      pauVar17 = pauVar17 + 1;
                      iVar47 = iVar47 + -1;
                    } while (iVar47 != 0);
                  }
                  lVar21 = lVar54 + 0x10;
                  uVar43 = lVar54 + 0x1f;
                  lVar54 = lVar21;
                } while (uVar43 < uVar29);
              }
              if ((int)((uint)lVar21 | 7) < (int)uVar29) {
                lVar18 = (long)(iVar59 * 4);
                lVar19 = (long)iVar59;
                lVar20 = (long)(iVar59 * 2);
                lVar39 = (long)(sVar6 * 0x300000000) >> 0x20;
                lVar40 = (long)(sVar6 * 0x500000000) >> 0x20;
                lVar41 = (long)(sVar6 * 0x600000000) >> 0x20;
                lVar42 = (long)(sVar6 * 0x700000000) >> 0x20;
                auVar69 = vpbroadcastd_avx512vl();
                auVar69 = vpmulld_avx2(auVar69,_DAT_005f4000);
                lVar54 = (long)(int)(uint)lVar21;
                do {
                  pauVar32 = (undefined1 (*) [64])
                             ((long)local_260->data +
                             (long)(iVar50 * iVar24) * 4 + (lVar54 + lVar23) * lVar19 * 4);
                  uVar35 = 0;
                  if (0xf < (int)uVar55) {
                    iVar47 = 0xf;
                    do {
                      pauVar28 = pauVar17;
                      auVar76 = vmovdqa64_avx512f(*pauVar28);
                      auVar77 = vmovdqa64_avx512f(pauVar28[2]);
                      auVar78 = vmovdqa64_avx512f(pauVar28[4]);
                      auVar79 = vpshufd_avx512f(pauVar28[1],0x93);
                      auVar80 = vpshufd_avx512f(pauVar28[3],0x93);
                      auVar81 = vpshufd_avx512f(pauVar28[5],0x93);
                      auVar82 = vmovdqa64_avx512f(pauVar28[6]);
                      auVar83 = vpshufd_avx512f(pauVar28[7],0x93);
                      auVar84 = vpunpckldq_avx512f(auVar76,auVar80);
                      auVar76 = vpunpckhdq_avx512f(auVar76,auVar80);
                      auVar80 = vpunpckldq_avx512f(auVar77,auVar79);
                      auVar77 = vpunpckhdq_avx512f(auVar77,auVar79);
                      auVar79 = vpunpckldq_avx512f(auVar78,auVar83);
                      auVar78 = vpunpckhdq_avx512f(auVar78,auVar83);
                      auVar83 = vpunpckldq_avx512f(auVar82,auVar81);
                      auVar81 = vpunpckhdq_avx512f(auVar82,auVar81);
                      auVar82 = vpunpcklqdq_avx512f(auVar84,auVar80);
                      auVar85 = vpunpcklqdq_avx512f(auVar77,auVar76);
                      auVar86 = vpunpcklqdq_avx512f(auVar79,auVar83);
                      auVar87 = vpunpcklqdq_avx512f(auVar81,auVar78);
                      auVar80 = vpermt2d_avx512f(auVar80,auVar75,auVar84);
                      auVar76 = vpermt2d_avx512f(auVar76,auVar75,auVar77);
                      auVar77 = vpermt2d_avx512f(auVar83,auVar75,auVar79);
                      auVar78 = vpermt2d_avx512f(auVar78,auVar75,auVar81);
                      auVar79 = vshufi64x2_avx512f(auVar82,auVar86,0x14);
                      auVar81 = vshufi64x2_avx512f(auVar82,auVar86,0xbe);
                      auVar82 = vshufi64x2_avx512f(auVar80,auVar77,0x14);
                      auVar77 = vshufi64x2_avx512f(auVar80,auVar77,0xbe);
                      auVar80 = vshufi64x2_avx512f(auVar85,auVar87,0x14);
                      auVar83 = vshufi64x2_avx512f(auVar85,auVar87,0xbe);
                      auVar84 = vshufi64x2_avx512f(auVar76,auVar78,0x14);
                      auVar76 = vshufi64x2_avx512f(auVar76,auVar78,0xbe);
                      auVar78 = vshufi64x2_avx512f(auVar79,auVar81,0x88);
                      auVar85 = vshufi64x2_avx512f(auVar82,auVar77,0x88);
                      auVar86 = vshufi64x2_avx512f(auVar80,auVar83,0x88);
                      auVar87 = vshufi64x2_avx512f(auVar84,auVar76,0x88);
                      auVar79 = vshufi64x2_avx512f(auVar79,auVar81,0x77);
                      auVar77 = vshufi64x2_avx512f(auVar82,auVar77,0x77);
                      auVar80 = vshufi64x2_avx512f(auVar80,auVar83,0x77);
                      auVar76 = vshufi64x2_avx512f(auVar84,auVar76,0x77);
                      if (iVar50 == 8) {
                        auVar81 = vinserti64x4_avx512f(auVar78,auVar85._0_32_,1);
                        auVar82 = vinserti64x4_avx512f(auVar86,auVar87._0_32_,1);
                        auVar83 = vinserti64x4_avx512f(auVar79,auVar77._0_32_,1);
                        auVar84 = vinserti64x4_avx512f(auVar80,auVar76._0_32_,1);
                        auVar88 = vshufi64x2_avx512f(auVar78,auVar85,0xee);
                        auVar89 = vshufi64x2_avx512f(auVar86,auVar87,0xee);
                        auVar90 = vshufi64x2_avx512f(auVar79,auVar77,0xee);
                        auVar91 = vshufi64x2_avx512f(auVar80,auVar76,0xee);
                        auVar81 = vmovdqu64_avx512f(auVar81);
                        *pauVar32 = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar82);
                        pauVar32[1] = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar83);
                        pauVar32[2] = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar84);
                        pauVar32[3] = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar88);
                        pauVar32[4] = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar89);
                        pauVar32[5] = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar90);
                        pauVar32[6] = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar91);
                        pauVar32[7] = auVar81;
                        pauVar32 = pauVar32 + 8;
                      }
                      if (iVar50 == 4) {
                        auVar81 = vshufi64x2_avx512f(auVar78,auVar85,0x88);
                        auVar82 = vshufi64x2_avx512f(auVar86,auVar87,0x88);
                        auVar83 = vshufi64x2_avx512f(auVar79,auVar77,0x88);
                        auVar84 = vshufi64x2_avx512f(auVar80,auVar76,0x88);
                        auVar88 = vshufi64x2_avx512f(auVar78,auVar85,0xdd);
                        auVar89 = vshufi64x2_avx512f(auVar86,auVar87,0xdd);
                        auVar90 = vshufi64x2_avx512f(auVar79,auVar77,0xdd);
                        auVar76 = vshufi64x2_avx512f(auVar80,auVar76,0xdd);
                        auVar78 = vshufi64x2_avx512f(auVar81,auVar82,0x88);
                        auVar85 = vshufi64x2_avx512f(auVar83,auVar84,0x88);
                        auVar86 = vshufi64x2_avx512f(auVar81,auVar82,0xdd);
                        auVar87 = vshufi64x2_avx512f(auVar83,auVar84,0xdd);
                        auVar79 = vshufi64x2_avx512f(auVar88,auVar89,0x88);
                        auVar77 = vshufi64x2_avx512f(auVar90,auVar76,0x88);
                        auVar80 = vshufi64x2_avx512f(auVar88,auVar89,0xdd);
                        auVar76 = vshufi64x2_avx512f(auVar90,auVar76,0xdd);
                        auVar81 = vmovdqu64_avx512f(auVar78);
                        *pauVar32 = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar85);
                        pauVar32[1] = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar86);
                        pauVar32[2] = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar87);
                        pauVar32[3] = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(*pauVar32 + lVar18 * 4) = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar77);
                        *(undefined1 (*) [64])(pauVar32[1] + lVar18 * 4) = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(pauVar32[2] + lVar18 * 4) = auVar81;
                        auVar81 = vmovdqu64_avx512f(auVar76);
                        *(undefined1 (*) [64])(pauVar32[3] + lVar18 * 4) = auVar81;
                        pauVar32 = pauVar32 + 4;
                      }
                      if (iVar50 == 1) {
                        auVar81 = vpunpckldq_avx512f(auVar78,auVar85);
                        auVar82 = vpunpckldq_avx512f(auVar86,auVar87);
                        auVar83 = vpunpckldq_avx512f(auVar79,auVar77);
                        auVar84 = vpunpckldq_avx512f(auVar80,auVar76);
                        auVar78 = vpunpckhdq_avx512f(auVar78,auVar85);
                        auVar85 = vpunpckhdq_avx512f(auVar86,auVar87);
                        auVar77 = vpunpckhdq_avx512f(auVar79,auVar77);
                        auVar76 = vpunpckhdq_avx512f(auVar80,auVar76);
                        auVar79 = vpunpcklqdq_avx512f(auVar81,auVar82);
                        auVar80 = vpunpcklqdq_avx512f(auVar83,auVar84);
                        auVar81 = vpunpckhqdq_avx512f(auVar81,auVar82);
                        auVar82 = vpunpckhqdq_avx512f(auVar83,auVar84);
                        auVar83 = vpunpcklqdq_avx512f(auVar78,auVar85);
                        auVar84 = vpunpcklqdq_avx512f(auVar77,auVar76);
                        auVar78 = vpunpckhqdq_avx512f(auVar78,auVar85);
                        auVar76 = vpunpckhqdq_avx512f(auVar77,auVar76);
                        auVar77 = vmovdqa64_avx512f(auVar79);
                        auVar85 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
                        auVar77 = vpermt2q_avx512f(auVar77,auVar85,auVar80);
                        auVar86 = vmovdqa64_avx512f(auVar81);
                        auVar86 = vpermt2q_avx512f(auVar86,auVar85,auVar82);
                        auVar87 = vmovdqa64_avx512f(auVar83);
                        auVar87 = vpermt2q_avx512f(auVar87,auVar85,auVar84);
                        auVar88 = vmovdqa64_avx512f(auVar78);
                        auVar85 = vpermt2q_avx512f(auVar88,auVar85,auVar76);
                        auVar88 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
                        auVar79 = vpermt2q_avx512f(auVar79,auVar88,auVar80);
                        auVar80 = vpermt2q_avx512f(auVar81,auVar88,auVar82);
                        auVar81 = vpermt2q_avx512f(auVar83,auVar88,auVar84);
                        auVar78 = vpermt2q_avx512f(auVar78,auVar88,auVar76);
                        auVar76 = vmovdqu64_avx512f(auVar77);
                        *pauVar32 = auVar76;
                        auVar76 = vmovdqu64_avx512f(auVar86);
                        *(undefined1 (*) [64])(*pauVar32 + lVar19 * 4) = auVar76;
                        auVar76 = vmovdqu64_avx512f(auVar87);
                        *(undefined1 (*) [64])(*pauVar32 + lVar20 * 4) = auVar76;
                        auVar76 = vmovdqu64_avx512f(auVar85);
                        *(undefined1 (*) [64])(*pauVar32 + lVar39 * 4) = auVar76;
                        auVar76 = vmovdqu64_avx512f(auVar79);
                        *(undefined1 (*) [64])(*pauVar32 + lVar18 * 4) = auVar76;
                        auVar76 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(*pauVar32 + lVar40 * 4) = auVar76;
                        auVar76 = vmovdqu64_avx512f(auVar81);
                        *(undefined1 (*) [64])(*pauVar32 + lVar41 * 4) = auVar76;
                        auVar76 = vmovdqu64_avx512f(auVar78);
                        *(undefined1 (*) [64])(*pauVar32 + lVar42 * 4) = auVar76;
                        pauVar32 = pauVar32 + 1;
                      }
                      iVar47 = iVar47 + 0x10;
                      pauVar17 = pauVar28 + 8;
                    } while (iVar47 < (int)uVar55);
                    pauVar17 = pauVar28 + 8;
                    uVar35 = uVar55 & 0xfffffff0;
                  }
                  uVar30 = uVar35;
                  if ((int)(uVar35 | 7) < (int)uVar55) {
                    do {
                      pauVar28 = pauVar17;
                      auVar74 = *(undefined1 (*) [32])*pauVar28;
                      auVar112 = *(undefined1 (*) [32])(*pauVar28 + 0x20);
                      auVar67 = *(undefined1 (*) [32])pauVar28[1];
                      auVar73 = *(undefined1 (*) [32])(pauVar28[1] + 0x20);
                      auVar116 = *(undefined1 (*) [32])pauVar28[2];
                      auVar68 = *(undefined1 (*) [32])(pauVar28[2] + 0x20);
                      auVar2 = *(undefined1 (*) [32])pauVar28[3];
                      auVar117 = *(undefined1 (*) [32])(pauVar28[3] + 0x20);
                      auVar114 = vpshufd_avx2(auVar112,0x93);
                      auVar12 = vpshufd_avx2(auVar73,0x93);
                      auVar119 = vpshufd_avx2(auVar68,0x93);
                      auVar72 = vpshufd_avx2(auVar117,0x93);
                      auVar118 = vpunpckldq_avx2(auVar74,auVar12);
                      auVar12 = vpunpckhdq_avx2(auVar74,auVar12);
                      auVar71 = vpunpckldq_avx2(auVar67,auVar114);
                      auVar114 = vpunpckhdq_avx2(auVar67,auVar114);
                      auVar120 = vpunpckldq_avx2(auVar116,auVar72);
                      auVar72 = vpunpckhdq_avx2(auVar116,auVar72);
                      auVar70 = vpunpckldq_avx512vl(auVar2,auVar119);
                      auVar119 = vpunpckhdq_avx2(auVar2,auVar119);
                      auVar118 = vpunpcklqdq_avx2(auVar118,auVar71);
                      auVar114 = vpunpcklqdq_avx2(auVar114,auVar12);
                      auVar71 = vpunpcklqdq_avx512vl(auVar120,auVar70);
                      auVar12 = vpunpcklqdq_avx2(auVar119,auVar72);
                      auVar119 = vpunpcklqdq_avx2(auVar74,auVar73);
                      auVar72 = vpunpcklqdq_avx2(auVar112,auVar67);
                      auVar119 = vpblendd_avx2(auVar72,auVar119,0x66);
                      auVar112 = vpunpckhqdq_avx2(auVar67,auVar112);
                      auVar74 = vpunpckhqdq_avx2(auVar73,auVar74);
                      auVar67 = vpblendd_avx2(auVar74,auVar112,0x66);
                      auVar74 = vpunpcklqdq_avx2(auVar116,auVar117);
                      auVar112 = vpunpcklqdq_avx2(auVar68,auVar2);
                      auVar73 = vpblendd_avx2(auVar112,auVar74,0x66);
                      auVar74 = vpunpckhqdq_avx2(auVar2,auVar68);
                      auVar112 = vpunpckhqdq_avx2(auVar117,auVar116);
                      auVar74 = vpblendd_avx2(auVar112,auVar74,0x66);
                      auVar112 = vpblendd_avx2(auVar118,auVar71,0xf0);
                      auVar116 = vpblendd_avx2(auVar119,auVar73,0xf0);
                      auVar68 = vpblendd_avx2(auVar114,auVar12,0xf0);
                      auVar2 = vpblendd_avx2(auVar67,auVar74,0xf0);
                      auVar117 = vpblendd_avx2(auVar71,auVar118,0xf0);
                      auVar73 = vpblendd_avx2(auVar73,auVar119,0xf0);
                      auVar114 = vpblendd_avx2(auVar12,auVar114,0xf0);
                      auVar74 = vpblendd_avx2(auVar74,auVar67,0xf0);
                      if (iVar50 == 8) {
                        *(undefined1 (*) [32])*pauVar32 = auVar112;
                        *(undefined1 (*) [32])(*pauVar32 + 0x20) = auVar116;
                        *(undefined1 (*) [32])pauVar32[1] = auVar68;
                        *(undefined1 (*) [32])(pauVar32[1] + 0x20) = auVar2;
                        *(undefined1 (*) [32])pauVar32[2] = auVar117;
                        *(undefined1 (*) [32])(pauVar32[2] + 0x20) = auVar73;
                        *(undefined1 (*) [32])pauVar32[3] = auVar114;
                        *(undefined1 (*) [32])(pauVar32[3] + 0x20) = auVar74;
                        pauVar32 = pauVar32 + 4;
                      }
                      if (iVar50 == 4) {
                        auVar118._0_16_ =
                             ZEXT116(0) * auVar116._0_16_ + ZEXT116(1) * auVar112._0_16_;
                        auVar118._16_16_ =
                             ZEXT116(0) * auVar112._16_16_ + ZEXT116(1) * auVar116._0_16_;
                        auVar71._0_16_ = ZEXT116(0) * auVar2._0_16_ + ZEXT116(1) * auVar68._0_16_;
                        auVar71._16_16_ = ZEXT116(0) * auVar68._16_16_ + ZEXT116(1) * auVar2._0_16_;
                        auVar120._0_16_ = ZEXT116(0) * auVar73._0_16_ + ZEXT116(1) * auVar117._0_16_
                        ;
                        auVar120._16_16_ =
                             ZEXT116(0) * auVar117._16_16_ + ZEXT116(1) * auVar73._0_16_;
                        auVar70._0_16_ = ZEXT116(0) * auVar74._0_16_ + ZEXT116(1) * auVar114._0_16_;
                        auVar70._16_16_ =
                             ZEXT116(0) * auVar114._16_16_ + ZEXT116(1) * auVar74._0_16_;
                        auVar67 = vperm2i128_avx2(auVar112,auVar116,0x31);
                        auVar12 = vperm2i128_avx2(auVar68,auVar2,0x31);
                        auVar119 = vperm2i128_avx2(auVar117,auVar73,0x31);
                        auVar72 = vshufi64x2_avx512vl(auVar114,auVar74,3);
                        *(undefined1 (*) [32])*pauVar32 = auVar118;
                        *(undefined1 (*) [32])(*pauVar32 + 0x20) = auVar71;
                        *(undefined1 (*) [32])pauVar32[1] = auVar120;
                        *(undefined1 (*) [32])(pauVar32[1] + 0x20) = auVar70;
                        *(undefined1 (*) [32])(*pauVar32 + lVar18 * 4) = auVar67;
                        *(undefined1 (*) [32])(*pauVar32 + lVar18 * 4 + 0x20) = auVar12;
                        *(undefined1 (*) [32])(pauVar32[1] + lVar18 * 4) = auVar119;
                        auVar67 = vmovdqu64_avx512vl(auVar72);
                        *(undefined1 (*) [32])(pauVar32[1] + lVar18 * 4 + 0x20) = auVar67;
                        pauVar32 = pauVar32 + 2;
                      }
                      if (iVar50 == 1) {
                        auVar12 = vpunpckldq_avx2(auVar112,auVar116);
                        auVar112 = vpunpckhdq_avx2(auVar112,auVar116);
                        auVar116 = vpunpckldq_avx2(auVar68,auVar2);
                        auVar67 = vpunpckhdq_avx2(auVar68,auVar2);
                        auVar2 = vpunpckldq_avx2(auVar117,auVar73);
                        auVar73 = vpunpckhdq_avx2(auVar117,auVar73);
                        auVar117 = vpunpckldq_avx2(auVar114,auVar74);
                        auVar74 = vpunpckhdq_avx2(auVar114,auVar74);
                        auVar114 = vpunpcklqdq_avx2(auVar12,auVar116);
                        auVar116 = vpunpckhqdq_avx2(auVar12,auVar116);
                        auVar12 = vpunpcklqdq_avx2(auVar112,auVar67);
                        auVar68 = vpunpckhqdq_avx2(auVar112,auVar67);
                        auVar67 = vpunpcklqdq_avx2(auVar2,auVar117);
                        auVar112 = vpunpckhqdq_avx2(auVar2,auVar117);
                        auVar2 = vpunpcklqdq_avx2(auVar73,auVar74);
                        auVar73 = vpunpckhqdq_avx2(auVar73,auVar74);
                        auVar117._0_16_ = ZEXT116(0) * auVar67._0_16_ + ZEXT116(1) * auVar114._0_16_
                        ;
                        auVar117._16_16_ =
                             ZEXT116(0) * auVar114._16_16_ + ZEXT116(1) * auVar67._0_16_;
                        auVar119._0_16_ =
                             ZEXT116(0) * auVar112._0_16_ + ZEXT116(1) * auVar116._0_16_;
                        auVar119._16_16_ =
                             ZEXT116(0) * auVar116._16_16_ + ZEXT116(1) * auVar112._0_16_;
                        auVar72._0_16_ = ZEXT116(0) * auVar2._0_16_ + ZEXT116(1) * auVar12._0_16_;
                        auVar72._16_16_ = ZEXT116(0) * auVar12._16_16_ + ZEXT116(1) * auVar2._0_16_;
                        auVar121._0_16_ = ZEXT116(0) * auVar73._0_16_ + ZEXT116(1) * auVar68._0_16_;
                        auVar121._16_16_ =
                             ZEXT116(0) * auVar68._16_16_ + ZEXT116(1) * auVar73._0_16_;
                        auVar74 = vperm2f128_avx(auVar114,auVar67,0x31);
                        auVar112 = vperm2f128_avx(auVar116,auVar112,0x31);
                        auVar67 = vperm2f128_avx(auVar12,auVar2,0x31);
                        auVar73 = vperm2f128_avx(auVar68,auVar73,0x31);
                        *(undefined1 (*) [32])*pauVar32 = auVar117;
                        *(undefined1 (*) [32])(*pauVar32 + lVar19 * 4) = auVar119;
                        *(undefined1 (*) [32])(*pauVar32 + lVar20 * 4) = auVar72;
                        *(undefined1 (*) [32])(*pauVar32 + lVar39 * 4) = auVar121;
                        *(undefined1 (*) [32])(*pauVar32 + lVar18 * 4) = auVar74;
                        *(undefined1 (*) [32])(*pauVar32 + lVar40 * 4) = auVar112;
                        *(undefined1 (*) [32])(*pauVar32 + lVar41 * 4) = auVar67;
                        *(undefined1 (*) [32])(*pauVar32 + lVar42 * 4) = auVar73;
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x20);
                      }
                      uVar35 = uVar30 + 8;
                      iVar47 = uVar30 + 0xf;
                      pauVar17 = pauVar28 + 4;
                      uVar30 = uVar35;
                    } while (iVar47 < (int)uVar55);
                    pauVar17 = pauVar28 + 4;
                  }
                  uVar30 = uVar35;
                  if ((int)(uVar35 | 3) < (int)uVar55) {
                    do {
                      pauVar28 = pauVar17;
                      auVar74 = vpshufd_avx2(*(undefined1 (*) [32])(*pauVar28 + 0x20),0x93);
                      auVar112 = vpshufd_avx2(*(undefined1 (*) [32])(pauVar28[1] + 0x20),0x93);
                      auVar73 = vpunpckldq_avx2(*(undefined1 (*) [32])*pauVar28,auVar112);
                      auVar112 = vpunpckhdq_avx2(*(undefined1 (*) [32])*pauVar28,auVar112);
                      auVar116 = vpunpckldq_avx2(*(undefined1 (*) [32])pauVar28[1],auVar74);
                      auVar67 = vpunpckhdq_avx2(*(undefined1 (*) [32])pauVar28[1],auVar74);
                      auVar68 = vpunpcklqdq_avx2(auVar73,auVar116);
                      auVar2 = vpunpcklqdq_avx2(auVar67,auVar112);
                      auVar74 = vpmovsxbd_avx2(ZEXT816(0x60f0e07020b0a03));
                      auVar73 = vpermt2d_avx512vl(auVar116,auVar74,auVar73);
                      auVar74 = vpermt2d_avx512vl(auVar112,auVar74,auVar67);
                      if (iVar50 == 8) {
                        *(undefined1 (*) [32])*pauVar32 = auVar68;
                        *(undefined1 (*) [32])(*pauVar32 + 0x20) = auVar73;
                        *(undefined1 (*) [32])pauVar32[1] = auVar2;
                        *(undefined1 (*) [32])(pauVar32[1] + 0x20) = auVar74;
                        pauVar32 = pauVar32 + 2;
                      }
                      if (iVar50 == 4) {
                        auVar116._0_16_ = ZEXT116(0) * auVar73._0_16_ + ZEXT116(1) * auVar68._0_16_;
                        auVar116._16_16_ =
                             ZEXT116(0) * auVar68._16_16_ + ZEXT116(1) * auVar73._0_16_;
                        auVar114._0_16_ = ZEXT116(0) * auVar74._0_16_ + ZEXT116(1) * auVar2._0_16_;
                        auVar114._16_16_ = ZEXT116(0) * auVar2._16_16_ + ZEXT116(1) * auVar74._0_16_
                        ;
                        auVar112 = vperm2i128_avx2(auVar68,auVar73,0x31);
                        auVar67 = vperm2i128_avx2(auVar2,auVar74,0x31);
                        *(undefined1 (*) [32])*pauVar32 = auVar116;
                        *(undefined1 (*) [32])(*pauVar32 + 0x20) = auVar114;
                        *(undefined1 (*) [32])(*pauVar32 + lVar18 * 4) = auVar112;
                        *(undefined1 (*) [32])(*pauVar32 + lVar18 * 4 + 0x20) = auVar67;
                        pauVar32 = pauVar32 + 1;
                      }
                      if (iVar50 == 1) {
                        auVar67 = vpunpckldq_avx2(auVar68,auVar73);
                        auVar112 = vpunpckhdq_avx2(auVar68,auVar73);
                        auVar73 = vpunpckldq_avx2(auVar2,auVar74);
                        auVar74 = vpunpckhdq_avx2(auVar2,auVar74);
                        auVar116 = vpunpcklqdq_avx2(auVar67,auVar73);
                        auVar67 = vpunpckhqdq_avx2(auVar67,auVar73);
                        auVar73 = vpunpcklqdq_avx2(auVar112,auVar74);
                        auVar74 = vpunpckhqdq_avx2(auVar112,auVar74);
                        *(undefined1 (*) [16])*pauVar32 = auVar116._0_16_;
                        *(undefined1 (*) [16])(*pauVar32 + lVar19 * 4) = auVar67._0_16_;
                        *(undefined1 (*) [16])(*pauVar32 + lVar20 * 4) = auVar73._0_16_;
                        *(undefined1 (*) [16])(*pauVar32 + lVar39 * 4) = auVar74._0_16_;
                        *(undefined1 (*) [16])(*pauVar32 + lVar18 * 4) = auVar116._16_16_;
                        *(undefined1 (*) [16])(*pauVar32 + lVar40 * 4) = auVar67._16_16_;
                        *(undefined1 (*) [16])(*pauVar32 + lVar41 * 4) = auVar73._16_16_;
                        *(undefined1 (*) [16])(*pauVar32 + lVar42 * 4) = auVar74._16_16_;
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x10);
                      }
                      uVar35 = uVar30 + 4;
                      iVar47 = uVar30 + 7;
                      pauVar17 = pauVar28 + 2;
                      uVar30 = uVar35;
                    } while (iVar47 < (int)uVar55);
                    pauVar17 = pauVar28 + 2;
                  }
                  uVar30 = uVar35;
                  if ((int)(uVar35 | 1) < (int)uVar55) {
                    do {
                      pauVar28 = pauVar17;
                      auVar74 = vpblendd_avx2(*(undefined1 (*) [32])*pauVar28,
                                              *(undefined1 (*) [32])(*pauVar28 + 0x20),0xaa);
                      auVar112 = vpblendd_avx2(*(undefined1 (*) [32])(*pauVar28 + 0x20),
                                               *(undefined1 (*) [32])*pauVar28,0xaa);
                      if (iVar50 == 8) {
                        *(undefined1 (*) [32])*pauVar32 = auVar74;
                        *(undefined1 (*) [32])(*pauVar32 + 0x20) = auVar112;
                        pauVar32 = pauVar32 + 1;
                      }
                      if (iVar50 == 4) {
                        auVar73._0_16_ = ZEXT116(0) * auVar112._0_16_ + ZEXT116(1) * auVar74._0_16_;
                        auVar73._16_16_ =
                             ZEXT116(0) * auVar74._16_16_ + ZEXT116(1) * auVar112._0_16_;
                        auVar67 = vperm2i128_avx2(auVar74,auVar112,0x31);
                        *(undefined1 (*) [32])*pauVar32 = auVar73;
                        *(undefined1 (*) [32])(*pauVar32 + lVar18 * 4) = auVar67;
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x20);
                      }
                      if (iVar50 == 1) {
                        vpscatterdd_avx512vl
                                  (ZEXT832(pauVar32) + auVar69 * (undefined1  [32])0x4,0xffff,
                                   auVar74);
                        vpscatterdd_avx512vl
                                  (ZEXT832(pauVar32) + ZEXT832(4) + auVar69 * (undefined1  [32])0x4,
                                   0xffff,auVar112);
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 8);
                      }
                      uVar35 = uVar30 + 2;
                      iVar47 = uVar30 + 3;
                      pauVar17 = pauVar28 + 1;
                      uVar30 = uVar35;
                    } while (iVar47 < (int)uVar55);
                    pauVar17 = pauVar28 + 1;
                  }
                  iVar47 = uVar55 - uVar35;
                  if (iVar47 != 0 && (int)uVar35 <= (int)uVar55) {
                    do {
                      auVar74 = *(undefined1 (*) [32])*pauVar17;
                      if (iVar50 == 8) {
                        *(undefined1 (*) [32])*pauVar32 = auVar74;
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x20);
                      }
                      if (iVar50 == 4) {
                        *(undefined1 (*) [16])*pauVar32 = auVar74._0_16_;
                        *(undefined1 (*) [16])(*pauVar32 + lVar18 * 4) = auVar74._16_16_;
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x10);
                      }
                      if (iVar50 == 1) {
                        vpscatterdd_avx512vl
                                  (ZEXT832(pauVar32) + auVar69 * (undefined1  [32])0x4,0xffff,
                                   auVar74);
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 4);
                      }
                      pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
                      iVar47 = iVar47 + -1;
                    } while (iVar47 != 0);
                  }
                  lVar21 = lVar54 + 8;
                  lVar46 = lVar54 + 0xf;
                  lVar54 = lVar21;
                } while (lVar46 < (long)local_268);
              }
              if ((int)((uint)lVar21 | 3) < (int)uVar29) {
                lVar18 = (long)iVar59;
                lVar19 = (long)(iVar59 * 2);
                lVar20 = (long)(sVar6 * 0x300000000) >> 0x20;
                auVar66 = vpbroadcastd_avx512vl();
                auVar66 = vpmulld_avx(auVar66,_DAT_005f25d0);
                lVar54 = (long)(int)(uint)lVar21;
                do {
                  pauVar32 = (undefined1 (*) [64])
                             ((long)local_260->data +
                             (long)(iVar50 * iVar24) * 4 + (lVar23 + lVar54) * lVar18 * 4);
                  uVar35 = 0;
                  if (0xf < (int)uVar55) {
                    iVar47 = 0xf;
                    do {
                      auVar76 = vmovdqu64_avx512f(*pauVar17);
                      auVar77 = vpshufd_avx512f(pauVar17[1],0x93);
                      auVar78 = vmovdqu64_avx512f(pauVar17[2]);
                      auVar79 = vpshufd_avx512f(pauVar17[3],0x93);
                      auVar80 = vpunpckldq_avx512f(auVar76,auVar79);
                      auVar81 = vpunpckldq_avx512f(auVar78,auVar77);
                      auVar76 = vpunpckhdq_avx512f(auVar76,auVar79);
                      auVar77 = vpunpckhdq_avx512f(auVar78,auVar77);
                      auVar78 = vpunpcklqdq_avx512f(auVar80,auVar81);
                      auVar79 = vpunpcklqdq_avx512f(auVar77,auVar76);
                      auVar80 = vpermt2d_avx512f(auVar81,auVar75,auVar80);
                      auVar76 = vpermt2d_avx512f(auVar76,auVar75,auVar77);
                      if (iVar50 == 4) {
                        auVar77 = vinserti64x4_avx512f(auVar78,auVar80._0_32_,1);
                        auVar81 = vinserti64x4_avx512f(auVar79,auVar76._0_32_,1);
                        auVar82 = vshufi64x2_avx512f(auVar78,auVar80,0xee);
                        auVar76 = vshufi64x2_avx512f(auVar79,auVar76,0xee);
                        auVar78 = vshufi64x2_avx512f(auVar77,auVar81,0x88);
                        auVar80 = vshufi64x2_avx512f(auVar77,auVar81,0xdd);
                        auVar79 = vshufi64x2_avx512f(auVar82,auVar76,0x88);
                        auVar76 = vshufi64x2_avx512f(auVar82,auVar76,0xdd);
                        auVar77 = vmovdqu64_avx512f(auVar78);
                        *pauVar32 = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar80);
                        pauVar32[1] = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar79);
                        pauVar32[2] = auVar77;
                        auVar77 = vmovdqu64_avx512f(auVar76);
                        pauVar32[3] = auVar77;
                        pauVar32 = pauVar32 + 4;
                      }
                      if (iVar50 == 1) {
                        auVar77 = vpunpckldq_avx512f(auVar78,auVar80);
                        auVar81 = vpunpckldq_avx512f(auVar79,auVar76);
                        auVar78 = vpunpckhdq_avx512f(auVar78,auVar80);
                        auVar76 = vpunpckhdq_avx512f(auVar79,auVar76);
                        auVar79 = vpunpcklqdq_avx512f(auVar77,auVar81);
                        auVar77 = vpunpckhqdq_avx512f(auVar77,auVar81);
                        auVar80 = vpunpcklqdq_avx512f(auVar78,auVar76);
                        auVar78 = vpunpckhqdq_avx512f(auVar78,auVar76);
                        auVar76 = vmovdqu64_avx512f(auVar79);
                        *pauVar32 = auVar76;
                        auVar76 = vmovdqu64_avx512f(auVar77);
                        *(undefined1 (*) [64])(*pauVar32 + lVar18 * 4) = auVar76;
                        auVar76 = vmovdqu64_avx512f(auVar80);
                        *(undefined1 (*) [64])(*pauVar32 + lVar19 * 4) = auVar76;
                        auVar76 = vmovdqu64_avx512f(auVar78);
                        *(undefined1 (*) [64])(*pauVar32 + lVar20 * 4) = auVar76;
                        pauVar32 = pauVar32 + 1;
                      }
                      pauVar17 = pauVar17 + 4;
                      iVar47 = iVar47 + 0x10;
                      uVar35 = uVar55 & 0xfffffff0;
                    } while (iVar47 < (int)uVar55);
                  }
                  uVar30 = uVar35 | 7;
                  while ((int)uVar30 < (int)uVar55) {
                    auVar63 = vpshufd_avx(*(undefined1 (*) [16])pauVar17[1],0x93);
                    auVar64 = vpshufd_avx(*(undefined1 (*) [16])(pauVar17[1] + 0x10),0x93);
                    auVar111 = vpshufd_avx(*(undefined1 (*) [16])(pauVar17[1] + 0x20),0x93);
                    auVar65 = vpshufd_avx(*(undefined1 (*) [16])(pauVar17[1] + 0x30),0x93);
                    auVar107 = vpunpckldq_avx(*(undefined1 (*) [16])*pauVar17,auVar111);
                    auVar111 = vpunpckhdq_avx(*(undefined1 (*) [16])*pauVar17,auVar111);
                    auVar109 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar17 + 0x10),auVar65);
                    auVar65 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar17 + 0x10),auVar65);
                    auVar108 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar17 + 0x20),auVar63);
                    auVar115 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar17 + 0x20),auVar63);
                    auVar110 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar17 + 0x30),auVar64);
                    auVar113 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar17 + 0x30),auVar64);
                    auVar8 = vpunpcklqdq_avx(auVar107,auVar108);
                    auVar9 = vpunpcklqdq_avx(auVar115,auVar111);
                    auVar10 = vpunpcklqdq_avx(auVar109,auVar110);
                    auVar11 = vpunpcklqdq_avx(auVar113,auVar65);
                    auVar63 = vpunpckhdq_avx(auVar108,auVar107);
                    auVar63 = vpshufd_avx(auVar63,0x36);
                    auVar64 = vpunpckhdq_avx(auVar111,auVar115);
                    auVar64 = vpshufd_avx(auVar64,0x36);
                    auVar111 = vpunpckhdq_avx(auVar110,auVar109);
                    auVar111 = vpshufd_avx(auVar111,0x36);
                    auVar65 = vpunpckhdq_avx(auVar65,auVar113);
                    auVar65 = vpshufd_avx(auVar65,0x36);
                    if (iVar50 == 4) {
                      *(undefined1 (*) [16])*pauVar32 = auVar8;
                      *(undefined1 (*) [16])(*pauVar32 + 0x10) = auVar63;
                      *(undefined1 (*) [16])(*pauVar32 + 0x20) = auVar9;
                      *(undefined1 (*) [16])(*pauVar32 + 0x30) = auVar64;
                      *(undefined1 (*) [16])pauVar32[1] = auVar10;
                      *(undefined1 (*) [16])(pauVar32[1] + 0x10) = auVar111;
                      *(undefined1 (*) [16])(pauVar32[1] + 0x20) = auVar11;
                      *(undefined1 (*) [16])(pauVar32[1] + 0x30) = auVar65;
                      pauVar32 = pauVar32 + 2;
                    }
                    if (iVar50 == 1) {
                      auVar115 = vpunpckldq_avx(auVar8,auVar63);
                      auVar63 = vpunpckhdq_avx(auVar8,auVar63);
                      auVar113 = vpunpckldq_avx(auVar9,auVar64);
                      auVar64 = vpunpckhdq_avx(auVar9,auVar64);
                      auVar109 = vpunpcklqdq_avx(auVar115,auVar113);
                      auVar115 = vpunpckhqdq_avx(auVar115,auVar113);
                      auVar108 = vpunpcklqdq_avx(auVar63,auVar64);
                      auVar113 = vpunpckhqdq_avx(auVar63,auVar64);
                      auVar107 = vpunpckldq_avx(auVar10,auVar111);
                      auVar63 = vpunpckhdq_avx(auVar10,auVar111);
                      auVar111 = vpunpckldq_avx(auVar11,auVar65);
                      auVar64 = vpunpckhdq_avx(auVar11,auVar65);
                      auVar65 = vpunpcklqdq_avx(auVar107,auVar111);
                      auVar111 = vpunpckhqdq_avx(auVar107,auVar111);
                      auVar107 = vpunpcklqdq_avx(auVar63,auVar64);
                      auVar63 = vpunpckhqdq_avx(auVar63,auVar64);
                      *(undefined1 (*) [16])*pauVar32 = auVar109;
                      *(undefined1 (*) [16])(*pauVar32 + 0x10) = auVar65;
                      *(undefined1 (*) [16])(*pauVar32 + lVar18 * 4) = auVar115;
                      *(undefined1 (*) [16])(*pauVar32 + lVar18 * 4 + 0x10) = auVar111;
                      *(undefined1 (*) [16])(*pauVar32 + lVar19 * 4) = auVar108;
                      *(undefined1 (*) [16])(*pauVar32 + lVar19 * 4 + 0x10) = auVar107;
                      *(undefined1 (*) [16])(*pauVar32 + lVar20 * 4) = auVar113;
                      *(undefined1 (*) [16])(*pauVar32 + lVar20 * 4 + 0x10) = auVar63;
                      pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x20);
                    }
                    pauVar17 = pauVar17 + 2;
                    uVar30 = uVar35 + 0xf;
                    uVar35 = uVar35 + 8;
                  }
                  uVar30 = uVar35 | 3;
                  while ((int)uVar30 < (int)uVar55) {
                    auVar63 = vpshufd_avx(*(undefined1 (*) [16])(*pauVar17 + 0x10),0x93);
                    auVar64 = vpshufd_avx(*(undefined1 (*) [16])(*pauVar17 + 0x30),0x93);
                    auVar65 = vpunpckldq_avx(*(undefined1 (*) [16])*pauVar17,auVar64);
                    auVar64 = vpunpckhdq_avx(*(undefined1 (*) [16])*pauVar17,auVar64);
                    auVar115 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar17 + 0x20),auVar63);
                    auVar111 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar17 + 0x20),auVar63);
                    auVar113 = vpunpcklqdq_avx(auVar65,auVar115);
                    auVar107 = vpunpcklqdq_avx(auVar111,auVar64);
                    auVar63 = vpunpckhdq_avx(auVar115,auVar65);
                    auVar63 = vpshufd_avx(auVar63,0x36);
                    auVar64 = vpunpckhdq_avx(auVar64,auVar111);
                    auVar64 = vpshufd_avx(auVar64,0x36);
                    if (iVar50 == 4) {
                      *(undefined1 (*) [16])*pauVar32 = auVar113;
                      *(undefined1 (*) [16])(*pauVar32 + 0x10) = auVar63;
                      *(undefined1 (*) [16])(*pauVar32 + 0x20) = auVar107;
                      *(undefined1 (*) [16])(*pauVar32 + 0x30) = auVar64;
                      pauVar32 = pauVar32 + 1;
                    }
                    if (iVar50 == 1) {
                      auVar111 = vpunpckldq_avx(auVar113,auVar63);
                      auVar63 = vpunpckhdq_avx(auVar113,auVar63);
                      auVar65 = vpunpckldq_avx(auVar107,auVar64);
                      auVar64 = vpunpckhdq_avx(auVar107,auVar64);
                      auVar115 = vpunpcklqdq_avx(auVar111,auVar65);
                      auVar111 = vpunpckhqdq_avx(auVar111,auVar65);
                      auVar65 = vpunpcklqdq_avx(auVar63,auVar64);
                      auVar63 = vpunpckhqdq_avx(auVar63,auVar64);
                      *(undefined1 (*) [16])*pauVar32 = auVar115;
                      *(undefined1 (*) [16])(*pauVar32 + lVar18 * 4) = auVar111;
                      *(undefined1 (*) [16])(*pauVar32 + lVar19 * 4) = auVar65;
                      *(undefined1 (*) [16])(*pauVar32 + lVar20 * 4) = auVar63;
                      pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x10);
                    }
                    pauVar17 = pauVar17 + 1;
                    uVar30 = uVar35 + 7;
                    uVar35 = uVar35 + 4;
                  }
                  uVar30 = uVar35 | 1;
                  while ((int)uVar30 < (int)uVar55) {
                    auVar63 = vpblendd_avx2(*(undefined1 (*) [16])*pauVar17,
                                            *(undefined1 (*) [16])(*pauVar17 + 0x10),10);
                    auVar64 = vpblendd_avx2(*(undefined1 (*) [16])(*pauVar17 + 0x10),
                                            *(undefined1 (*) [16])*pauVar17,10);
                    if (iVar50 == 4) {
                      *(undefined1 (*) [16])*pauVar32 = auVar63;
                      *(undefined1 (*) [16])(*pauVar32 + 0x10) = auVar64;
                      pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x20);
                    }
                    if (iVar50 == 1) {
                      auVar8._8_8_ = 0;
                      auVar8._0_8_ = pauVar32;
                      vpscatterdd_avx512vl(auVar8 + auVar66 * (undefined1  [16])0x4,0xffff,auVar63);
                      auVar9._8_8_ = 0;
                      auVar9._0_8_ = pauVar32;
                      vpscatterdd_avx512vl
                                (auVar9 + ZEXT816(4) + auVar66 * (undefined1  [16])0x4,0xffff,
                                 auVar64);
                      pauVar32 = (undefined1 (*) [64])(*pauVar32 + 8);
                    }
                    pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
                    uVar30 = uVar35 + 3;
                    uVar35 = uVar35 + 2;
                  }
                  iVar47 = uVar55 - uVar35;
                  if (iVar47 != 0 && (int)uVar35 <= (int)uVar55) {
                    do {
                      auVar63 = *(undefined1 (*) [16])*pauVar17;
                      if (iVar50 == 4) {
                        *(undefined1 (*) [16])*pauVar32 = auVar63;
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x10);
                      }
                      if (iVar50 == 1) {
                        auVar10._8_8_ = 0;
                        auVar10._0_8_ = pauVar32;
                        vpscatterdd_avx512vl
                                  (auVar10 + auVar66 * (undefined1  [16])0x4,0xffff,auVar63);
                        pauVar32 = (undefined1 (*) [64])(*pauVar32 + 4);
                      }
                      pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
                      iVar47 = iVar47 + -1;
                    } while (iVar47 != 0);
                  }
                  lVar21 = lVar54 + 4;
                  lVar39 = lVar54 + 7;
                  lVar54 = lVar21;
                } while (lVar39 < (long)local_268);
              }
              uVar35 = (uint)lVar21;
              lVar54 = (long)iVar24;
              if ((int)(uVar35 | 1) < (int)uVar29) {
                lVar40 = (long)iVar59;
                lVar21 = lVar23 + (int)uVar35;
                lVar18 = lVar21 * 4 * lVar40 + lVar54 * 4;
                lVar19 = (lVar21 * 4 + 4) * lVar40 + lVar54 * 4;
                lVar20 = lVar40 * 4;
                lVar39 = (long)(int)uVar35;
                do {
                  pvVar7 = local_260->data;
                  if ((int)uVar55 < 0x10) {
                    uVar35 = 0;
                    lVar21 = lVar54 * 4 + (lVar23 + lVar39) * lVar40 * 4;
                  }
                  else {
                    iVar50 = 0xf;
                    lVar21 = 0;
                    pauVar32 = pauVar17;
                    do {
                      pauVar28 = pauVar32;
                      pauVar32 = (undefined1 (*) [64])(*pauVar17 + lVar21 * 2);
                      auVar76 = vmovdqu64_avx512f(*pauVar32);
                      auVar77 = vmovdqu64_avx512f(pauVar32[1]);
                      auVar78 = vpunpckldq_avx512f(auVar76,auVar77);
                      auVar76 = vpunpckhdq_avx512f(auVar76,auVar77);
                      auVar77 = vpunpcklqdq_avx512f(auVar78,auVar76);
                      auVar78 = vpermt2d_avx512f(auVar76,auVar75,auVar78);
                      auVar76 = vmovdqu64_avx512f(auVar77);
                      *(undefined1 (*) [64])((long)pvVar7 + lVar21 + lVar18) = auVar76;
                      auVar76 = vmovdqu64_avx512f(auVar78);
                      *(undefined1 (*) [64])((long)pvVar7 + lVar21 + lVar19) = auVar76;
                      lVar21 = lVar21 + 0x40;
                      iVar50 = iVar50 + 0x10;
                      pauVar32 = pauVar32 + 2;
                    } while (iVar50 < (int)uVar55);
                    pauVar17 = pauVar28 + 2;
                    lVar21 = lVar21 + lVar18;
                    uVar35 = uVar55 & 0xfffffff0;
                  }
                  pauVar62 = (undefined1 (*) [16])((long)pvVar7 + lVar21);
                  if ((int)(uVar35 | 7) < (int)uVar55) {
                    lVar41 = 0;
                    lVar21 = 0;
                    pauVar32 = pauVar17;
                    do {
                      pauVar28 = pauVar32;
                      lVar42 = lVar21;
                      pauVar1 = (undefined1 (*) [16])(*pauVar17 + lVar41 * 8);
                      auVar66 = vpermilps_avx(pauVar1[2],0xb1);
                      auVar63 = vpermilps_avx(pauVar1[3],0xb1);
                      auVar65 = vunpcklps_avx(*pauVar1,auVar66);
                      auVar64 = vunpckhps_avx(*pauVar1,auVar66);
                      auVar115 = vunpcklps_avx(pauVar1[1],auVar63);
                      auVar111 = vunpckhps_avx(pauVar1[1],auVar63);
                      auVar66 = vmovlhps_avx(auVar65,auVar64);
                      auVar63 = vmovlhps_avx(auVar115,auVar111);
                      auVar64 = vshufps_avx(auVar65,auVar64,0xbb);
                      auVar111 = vshufps_avx(auVar115,auVar111,0xbb);
                      *(undefined1 (*) [16])(*pauVar62 + lVar41 * 4) = auVar66;
                      *(undefined1 (*) [16])(pauVar62[1] + lVar41 * 4) = auVar63;
                      *(undefined1 (*) [16])(*pauVar62 + lVar41 * 4 + lVar20) = auVar64;
                      *(undefined1 (*) [16])(pauVar62[1] + lVar41 * 4 + lVar20) = auVar111;
                      lVar41 = lVar41 + 8;
                      lVar21 = lVar42 + 0x20;
                      pauVar32 = (undefined1 (*) [64])(pauVar1 + 4);
                    } while ((int)(uVar35 + (int)lVar41 + 7) < (int)uVar55);
                    pauVar17 = pauVar28 + 1;
                    pauVar62 = (undefined1 (*) [16])(pauVar62[2] + lVar42);
                    uVar35 = uVar35 + (int)lVar41;
                  }
                  uVar30 = uVar35 | 3;
                  while ((int)uVar30 < (int)uVar55) {
                    auVar64 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar17,
                                            *(undefined1 (*) [16])(*pauVar17 + 0x10));
                    auVar63 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar17,
                                            *(undefined1 (*) [16])(*pauVar17 + 0x10));
                    auVar66 = vmovlhps_avx(auVar64,auVar63);
                    auVar63 = vunpckhps_avx(auVar63,auVar64);
                    auVar63 = vshufps_avx(auVar63,auVar63,0x36);
                    *pauVar62 = auVar66;
                    *(undefined1 (*) [16])(*pauVar62 + lVar40 * 4) = auVar63;
                    pauVar62 = pauVar62 + 1;
                    pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
                    uVar30 = uVar35 + 7;
                    uVar35 = uVar35 + 4;
                  }
                  if ((int)(uVar35 | 1) < (int)uVar55) {
                    lVar21 = 0;
                    lVar42 = 0;
                    lVar41 = 0;
                    do {
                      uVar4 = *(undefined4 *)(*pauVar17 + lVar41 * 8 + 8);
                      uVar5 = *(undefined4 *)(*pauVar17 + lVar41 * 8 + 0xc);
                      *(undefined8 *)(*pauVar62 + lVar41 * 4) =
                           *(undefined8 *)(*pauVar17 + lVar41 * 8);
                      *(undefined4 *)(*pauVar62 + lVar41 * 4 + lVar20) = uVar4;
                      *(undefined4 *)
                       (*pauVar62 + lVar41 * 4 + ((long)((sVar6 << 0x20) + 0x100000000) >> 0x20) * 4
                       ) = uVar5;
                      lVar41 = lVar41 + 2;
                      lVar42 = lVar42 + 0x10;
                      lVar21 = lVar21 + 8;
                    } while ((int)((int)lVar41 + uVar35 + 1) < (int)uVar55);
                    pauVar17 = (undefined1 (*) [64])(*pauVar17 + lVar42);
                    pauVar62 = (undefined1 (*) [16])(*pauVar62 + lVar21);
                    uVar35 = uVar35 + (int)lVar41;
                  }
                  if ((int)uVar35 < (int)uVar55) {
                    lVar21 = 0;
                    do {
                      uVar4 = *(undefined4 *)(*pauVar17 + 4);
                      *(undefined4 *)(*pauVar62 + lVar21 * 4) = *(undefined4 *)*pauVar17;
                      *(undefined4 *)(*pauVar62 + lVar21 * 4 + lVar20) = uVar4;
                      pauVar17 = (undefined1 (*) [64])(*pauVar17 + 8);
                      lVar21 = lVar21 + 1;
                    } while (uVar55 - uVar35 != (int)lVar21);
                  }
                  lVar21 = lVar39 + 2;
                  lVar41 = lVar39 + 3;
                  lVar18 = lVar18 + lVar40 * 8;
                  lVar19 = lVar19 + lVar40 * 8;
                  lVar39 = lVar21;
                } while (lVar41 < (long)local_268);
              }
              if ((int)lVar21 < (int)uVar29) {
                uVar43 = (ulong)(int)lVar21;
                do {
                  pauVar32 = (undefined1 (*) [64])
                             ((long)local_260->data +
                             lVar54 * 4 + (lVar23 + uVar43) * (long)iVar59 * 4);
                  uVar35 = 0;
                  if (0xf < (int)uVar55) {
                    iVar50 = 0xf;
                    do {
                      *pauVar32 = *pauVar17;
                      pauVar32 = pauVar32 + 1;
                      pauVar17 = pauVar17 + 1;
                      iVar50 = iVar50 + 0x10;
                      uVar35 = uVar55 & 0xfffffff0;
                    } while (iVar50 < (int)uVar55);
                  }
                  uVar30 = uVar35 | 7;
                  while ((int)uVar30 < (int)uVar55) {
                    *(undefined1 (*) [32])*pauVar32 = *(undefined1 (*) [32])*pauVar17;
                    pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x20);
                    pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
                    uVar30 = uVar35 + 0xf;
                    uVar35 = uVar35 + 8;
                  }
                  uVar30 = uVar35 | 3;
                  while ((int)uVar30 < (int)uVar55) {
                    *(undefined1 (*) [16])*pauVar32 = *(undefined1 (*) [16])*pauVar17;
                    pauVar32 = (undefined1 (*) [64])(*pauVar32 + 0x10);
                    pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
                    uVar30 = uVar35 + 7;
                    uVar35 = uVar35 + 4;
                  }
                  uVar30 = uVar35 | 1;
                  while ((int)uVar30 < (int)uVar55) {
                    *(undefined8 *)*pauVar32 = *(undefined8 *)*pauVar17;
                    pauVar32 = (undefined1 (*) [64])(*pauVar32 + 8);
                    pauVar17 = (undefined1 (*) [64])(*pauVar17 + 8);
                    uVar30 = uVar35 + 3;
                    uVar35 = uVar35 + 2;
                  }
                  if ((int)uVar35 < (int)uVar55) {
                    lVar21 = 0;
                    do {
                      *(undefined4 *)(*pauVar32 + lVar21 * 4) = *(undefined4 *)*pauVar17;
                      pauVar17 = (undefined1 (*) [64])(*pauVar17 + 4);
                      lVar21 = lVar21 + 1;
                    } while (uVar55 - uVar35 != (int)lVar21);
                  }
                  uVar43 = uVar43 + 1;
                } while (uVar43 != local_268);
              }
              iVar24 = iVar24 + TILE_N;
              uVar43 = local_1f0;
            } while (iVar24 < N);
          }
          piVar13 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          iVar31 = iVar31 + 1;
        } while (iVar31 != local_204);
      }
      iVar31 = 0;
    }
    piVar13 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_258.allocator == (Allocator *)0x0) {
          if (local_258.data != (void *)0x0) {
            free(local_258.data);
          }
        }
        else {
          (*(local_258.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_258.cstep = 0;
    local_258.data = (void *)0x0;
    local_258.refcount._0_4_ = 0;
    local_258.refcount._4_4_ = 0;
    local_258.elemsize = 0;
    local_258.elempack = 0;
    local_258.dims = 0;
    local_258.w = 0;
    local_258.h = 0;
    local_258.d = 0;
    local_258.c = 0;
  }
  piVar13 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_1d8.allocator == (Allocator *)0x0) {
        if (local_1d8.data != (void *)0x0) {
          free(local_1d8.data);
        }
      }
      else {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar31;
}

Assistant:

static int convolution_im2col_gemm_int8(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int nT, const Option& opt)
{
    const int maxk = kernel_w * kernel_h;

    const int M = top_blob.c * top_blob.elempack;
    const int N = top_blob.w * top_blob.h;
    const int K = bottom_blob.c * bottom_blob.elempack * maxk;

    int TILE_M, TILE_N, TILE_K;
    convolution_im2col_gemm_get_optimal_tile_mnk_int8(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        // im2col
        convolution_im2col_input_tile_int8(bottom_blob, BT_tile, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
    }

    Mat topT(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (topT.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                const Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                convolution_gemm_transB_packed_tile_int8(AT_tile, BT_tile, topT_tile, i, max_ii, j, max_jj, k, max_kk);
            }

            unpack_output_tile_int32(topT_tile, top_blob, i, max_ii, j, max_jj);
        }
    }

    return 0;
}